

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void custom_seqnum_test(bool multi_kv)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  size_t keylen;
  size_t keylen_00;
  fdb_encryption_key new_key;
  void *ptr;
  long lVar3;
  fdb_iterator **ppfVar4;
  fdb_status fVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  btree *pbVar10;
  size_t sVar11;
  fdb_doc *pfVar12;
  fdb_kvs_handle **ppfVar13;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_handle *pfVar15;
  long lVar16;
  fdb_kvs_handle *handle;
  fdb_config *pfVar17;
  fdb_doc *pfVar18;
  char *pcVar19;
  uint uVar20;
  char *pcVar21;
  fdb_encryption_key *pfVar22;
  undefined7 in_register_00000039;
  char *unaff_R12;
  fdb_iterator **doc;
  code *unaff_R13;
  fdb_file_handle **ptr_fhandle;
  char *unaff_R14;
  ulong uVar23;
  fdb_doc **doc_00;
  fdb_iterator **ptr_iterator;
  fdb_iterator **unaff_R15;
  fdb_doc *pfVar24;
  fdb_doc **ppfVar25;
  char *pcVar26;
  fdb_kvs_handle **ptr_handle;
  bool bVar27;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_iterator *iterator;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char bodybuf [256];
  char keybuf [256];
  fdb_doc real_doc;
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_1e068;
  fdb_file_handle *pfStack_1e060;
  void *pvStack_1e058;
  size_t asStack_1e050 [3];
  undefined4 uStack_1e038;
  undefined4 uStack_1e034;
  undefined4 uStack_1e030;
  undefined4 uStack_1e02c;
  undefined4 uStack_1e028;
  fdb_kvs_config fStack_1e020;
  timeval tStack_1e008;
  fdb_config fStack_1dff8;
  char acStack_1df00 [256];
  char acStack_1de00 [256];
  char acStack_1dd00 [264];
  fdb_config *pfStack_1dbf8;
  fdb_iterator **ppfStack_1dbf0;
  fdb_kvs_handle *pfStack_1dbe8;
  fdb_iterator **ppfStack_1dbe0;
  fdb_kvs_handle *pfStack_1dbd8;
  code *pcStack_1dbd0;
  fdb_iterator *pfStack_1dbb8;
  fdb_file_handle *pfStack_1dbb0;
  fdb_kvs_handle *pfStack_1dba8;
  fdb_kvs_handle *pfStack_1dba0;
  fdb_kvs_config fStack_1db98;
  timeval tStack_1db80;
  fdb_config fStack_1db70;
  fdb_iterator *apfStack_1da78 [32];
  fdb_config fStack_1d978;
  fdb_kvs_handle **ppfStack_1d870;
  fdb_iterator **ppfStack_1d868;
  fdb_iterator **ppfStack_1d860;
  fdb_kvs_handle *pfStack_1d858;
  fdb_iterator *pfStack_1d848;
  fdb_kvs_handle *pfStack_1d840;
  fdb_iterator **ppfStack_1d838;
  fdb_kvs_handle *pfStack_1d830;
  fdb_kvs_config fStack_1d828;
  fdb_kvs_handle *apfStack_1d810 [8];
  undefined1 auStack_1d7d0 [64];
  fdb_iterator *apfStack_1d790 [33];
  fdb_config fStack_1d688;
  fdb_iterator *apfStack_1d590 [32];
  fdb_iterator *apfStack_1d490 [32];
  fdb_kvs_handle fStack_1d390;
  undefined8 auStack_1cf90 [896];
  fdb_kvs_handle *apfStack_1b390 [1025];
  fdb_doc **ppfStack_19388;
  char *pcStack_19380;
  long lStack_19378;
  fdb_doc *pfStack_19370;
  fdb_doc **ppfStack_19368;
  fdb_doc *pfStack_19360;
  fdb_doc *pfStack_19348;
  fdb_file_handle *pfStack_19340;
  long lStack_19338;
  fdb_kvs_handle *pfStack_19330;
  long lStack_19328;
  long lStack_19320;
  fdb_doc **ppfStack_19318;
  long lStack_19310;
  fdb_doc **ppfStack_19308;
  size_t sStack_19300;
  timeval tStack_192f8;
  fdb_kvs_config fStack_192e8;
  fdb_file_info fStack_192d0;
  fdb_doc afStack_19288 [3];
  char acStack_19188 [264];
  fdb_config fStack_19080;
  char acStack_18f88 [256];
  fdb_doc *apfStack_18e88 [2999];
  size_t sStack_130d0;
  size_t asStack_130c8 [1023];
  undefined1 auStack_110c9 [57225];
  fdb_doc **ppfStack_3140;
  fdb_config *pfStack_3138;
  fdb_file_handle **ppfStack_3130;
  ulong uStack_3128;
  fdb_kvs_handle **ppfStack_3120;
  fdb_kvs_handle **ppfStack_3118;
  fdb_doc *pfStack_3100;
  fdb_kvs_handle *pfStack_30f8;
  undefined1 auStack_30f0 [24];
  fdb_file_handle *pfStack_30d8;
  fdb_kvs_handle *pfStack_30d0;
  fdb_kvs_config fStack_30c8;
  fdb_doc *apfStack_30b0 [31];
  timeval tStack_2fb8;
  fdb_config fStack_2fa8;
  char acStack_2eb0 [256];
  fdb_file_handle *apfStack_2db0 [32];
  char acStack_2cb0 [264];
  fdb_kvs_handle **ppfStack_2ba8;
  char *pcStack_2ba0;
  char *pcStack_2b98;
  ulong uStack_2b90;
  undefined8 uStack_2b88;
  code *pcStack_2b80;
  fdb_file_handle *pfStack_2b78;
  fdb_kvs_handle *pfStack_2b70;
  char acStack_2b68 [32];
  fdb_kvs_config fStack_2b48;
  timeval tStack_2b30;
  fdb_file_info afStack_2b20 [3];
  fdb_config fStack_2a28;
  fdb_config *pfStack_2930;
  fdb_kvs_handle **ppfStack_2928;
  fdb_kvs_handle *pfStack_2920;
  fdb_doc *pfStack_2918;
  fdb_kvs_handle *pfStack_2910;
  fdb_encryption_key *pfStack_2908;
  fdb_kvs_handle *pfStack_28f8;
  fdb_file_handle *pfStack_28f0;
  undefined1 auStack_28e8 [8];
  undefined1 auStack_28e0 [48];
  fdb_kvs_handle *apfStack_28b0 [32];
  fdb_doc afStack_27b0 [3];
  fdb_config fStack_26b0;
  ulong uStack_25b8;
  fdb_kvs_handle **ppfStack_25b0;
  fdb_kvs_handle *pfStack_25a8;
  fdb_doc *pfStack_25a0;
  fdb_kvs_handle *pfStack_2598;
  fdb_encryption_key *pfStack_2590;
  fdb_doc *pfStack_2580;
  fdb_kvs_handle *pfStack_2578;
  fdb_kvs_handle *pfStack_2570;
  fdb_file_handle *pfStack_2568;
  fdb_file_handle *pfStack_2560;
  fdb_doc *apfStack_2558 [11];
  fdb_kvs_config fStack_2500;
  timeval tStack_24e8;
  fdb_kvs_handle fStack_24d8;
  fdb_config fStack_21d8;
  fdb_kvs_config *pfStack_20e0;
  fdb_file_handle **ppfStack_20d8;
  fdb_file_handle **ppfStack_20d0;
  fdb_kvs_handle **ppfStack_20c8;
  char *pcStack_20c0;
  fdb_doc *pfStack_20b8;
  fdb_file_handle *pfStack_20a0;
  fdb_kvs_handle *pfStack_2098;
  fdb_kvs_handle *pfStack_2090;
  fdb_file_handle *pfStack_2088;
  fdb_doc *apfStack_2080 [31];
  timeval tStack_1f88;
  fdb_kvs_config fStack_1f78;
  char acStack_1f60 [264];
  fdb_config fStack_1e58;
  char acStack_1d60 [256];
  char acStack_1c60 [264];
  fdb_kvs_handle *pfStack_1b58;
  fdb_kvs_handle *pfStack_1b50;
  fdb_kvs_handle *pfStack_1b48;
  fdb_kvs_handle *pfStack_1b40;
  fdb_kvs_handle **ppfStack_1b38;
  fdb_doc *pfStack_1b30;
  fdb_kvs_handle *pfStack_1b20;
  fdb_kvs_handle *pfStack_1b18;
  undefined1 auStack_1b10 [32];
  undefined1 auStack_1af0 [280];
  fdb_doc afStack_19d8 [3];
  fdb_config afStack_18d0 [2];
  fdb_kvs_handle *pfStack_16d0;
  fdb_kvs_handle *pfStack_16c8;
  fdb_kvs_handle *pfStack_16c0;
  fdb_doc *pfStack_16b8;
  fdb_doc **ppfStack_16b0;
  fdb_doc *pfStack_16a8;
  fdb_doc *pfStack_1698;
  fdb_kvs_handle *pfStack_1690;
  fdb_doc *pfStack_1688;
  fdb_doc *apfStack_1680 [5];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1658;
  timeval tStack_1628;
  fdb_doc afStack_1618 [3];
  fdb_doc afStack_1500 [3];
  char acStack_1400 [256];
  fdb_config fStack_1300;
  fdb_doc *pfStack_1208;
  fdb_kvs_handle *pfStack_1200;
  fdb_kvs_handle *pfStack_11f8;
  btree *pbStack_11f0;
  fdb_doc *pfStack_11e8;
  fdb_doc *pfStack_11e0;
  undefined1 auStack_11c8 [16];
  undefined1 auStack_11b8 [24];
  timeval tStack_11a0;
  undefined1 auStack_1190 [280];
  fdb_doc afStack_1078 [5];
  size_t *psStack_ee8;
  btree abStack_d58 [4];
  char acStack_c58 [256];
  fdb_config fStack_b58;
  fdb_kvs_handle **ppfStack_a60;
  fdb_kvs_handle *pfStack_a58;
  fdb_kvs_handle *pfStack_a50;
  fdb_kvs_handle *pfStack_a48;
  btree *pbStack_a40;
  fdb_doc *pfStack_a38;
  fdb_kvs_handle *pfStack_a28;
  undefined1 auStack_a20 [16];
  undefined1 auStack_a10 [40];
  btree *pbStack_9e8;
  undefined1 auStack_9b8 [40];
  undefined1 auStack_990 [256];
  undefined8 uStack_890;
  uint64_t uStack_888;
  uint64_t uStack_880;
  snap_handle *psStack_878;
  uint uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined4 uStack_860;
  undefined4 uStack_85c;
  undefined4 uStack_858;
  undefined4 uStack_854;
  atomic<unsigned_char> aStack_850;
  char acStack_790 [264];
  fdb_config fStack_688;
  char acStack_590 [264];
  fdb_kvs_handle *pfStack_488;
  fdb_kvs_handle *pfStack_480;
  fdb_kvs_handle *pfStack_478;
  fdb_kvs_handle *pfStack_470;
  fdb_iterator **ppfStack_468;
  fdb_doc *pfStack_460;
  fdb_doc *local_440;
  fdb_file_handle *local_438;
  int local_42c;
  fdb_iterator *local_428;
  undefined8 uStack_420;
  fdb_kvs_handle *local_418 [4];
  ulong local_3f8;
  undefined1 local_3f0 [40];
  undefined1 local_3c8 [80];
  undefined1 local_378 [512];
  fdb_doc local_178;
  fdb_custom_cmp_variable local_120;
  void *local_118;
  undefined1 local_108;
  undefined4 local_104;
  undefined1 local_f9;
  undefined1 local_e8;
  
  pcVar21 = (char *)(CONCAT71(in_register_00000039,multi_kv) & 0xffffffff);
  pfStack_460 = (fdb_doc *)0x115bc3;
  gettimeofday((timeval *)(local_3f0 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_460 = (fdb_doc *)0x115bc8;
  memleak_start();
  local_440 = (fdb_doc *)(local_378 + 0x200);
  local_178.seqnum = 0;
  local_178.deleted = false;
  local_178._73_3_ = 0;
  local_178.flags = 0;
  local_178.keylen = 0;
  local_178.metalen = 0;
  local_178.bodylen = 0;
  local_178.size_ondisk = 0;
  local_178.offset = 0;
  local_178.meta = (void *)0x0;
  local_178.key = local_378 + 0x100;
  local_178.body = local_378;
  pfStack_460 = (fdb_doc *)0x115c0f;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar15 = (fdb_kvs_handle *)&stack0xfffffffffffffed8;
  pfStack_460 = (fdb_doc *)0x115c1f;
  fdb_get_default_config();
  pfStack_460 = (fdb_doc *)0x115c29;
  fdb_get_default_kvs_config();
  local_120 = (fdb_custom_cmp_variable)0x0;
  local_118 = (void *)0x400;
  local_104 = 1;
  local_108 = 1;
  local_f9 = 0;
  local_e8 = SUB81(pcVar21,0);
  pfStack_460 = (fdb_doc *)0x115c60;
  fdb_open(&local_438,"./dummy1",(fdb_config *)pfVar15);
  local_42c = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_42c != 0) {
    unaff_R14 = (char *)0x3;
    pfVar15 = (fdb_kvs_handle *)0x18;
    unaff_R15 = &local_428;
    unaff_R12 = local_3f0;
    unaff_R13 = logCallbackFunc;
    pcVar21 = "custom_seqnum_test";
    do {
      pfStack_460 = (fdb_doc *)0x115ca3;
      sprintf((char *)unaff_R15,"kv%d",(ulong)unaff_R14 & 0xffffffff);
      pfStack_460 = (fdb_doc *)0x115cbb;
      fVar5 = fdb_kvs_open(local_438,
                           (fdb_kvs_handle **)
                           (&(pfVar15->kvs_config).create_if_missing + (long)local_418),
                           (char *)unaff_R15,(fdb_kvs_config *)unaff_R12);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001160ed;
      pfStack_460 = (fdb_doc *)0x115cd3;
      fVar5 = fdb_set_log_callback
                        ((fdb_kvs_handle *)
                         (&uStack_420)[(long)&(((fdb_kvs_handle *)unaff_R14)->kvs_config).field_0x1]
                         ,logCallbackFunc,"custom_seqnum_test");
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001160e8;
      pfVar15 = (fdb_kvs_handle *)&pfVar15[-1].bub_ctx.handle;
      bVar27 = (fdb_kvs_handle *)unaff_R14 != (fdb_kvs_handle *)0x0;
      unaff_R14 = (char *)((long)&(((fdb_kvs_handle *)((long)unaff_R14 + -0x208))->bub_ctx).handle +
                          7);
    } while (bVar27);
    pfVar14 = (fdb_kvs_handle *)0x4;
LAB_00115d2d:
    unaff_R15 = (fdb_iterator **)(local_378 + 0x100);
    unaff_R12 = "body%d";
    pcVar21 = (char *)0x0;
    do {
      pfStack_460 = (fdb_doc *)0x115d60;
      sprintf((char *)unaff_R15,"key%d",(ulong)pcVar21 & 0xffffffff);
      pfStack_460 = (fdb_doc *)0x115d6f;
      sprintf((char *)local_378,"body%d",(ulong)pcVar21 & 0xffffffff);
      pfVar15 = (fdb_kvs_handle *)(local_3c8 + (long)pcVar21 * 8);
      pfStack_460 = (fdb_doc *)0x115d82;
      sVar7 = strlen((char *)unaff_R15);
      pfStack_460 = (fdb_doc *)0x115d8e;
      sVar8 = strlen((char *)local_378);
      pfStack_460 = (fdb_doc *)0x115dab;
      fdb_doc_create((fdb_doc **)pfVar15,unaff_R15,sVar7 + 1,(void *)0x0,0,
                     (fdb_kvs_handle *)local_378,sVar8 + 1);
      unaff_R14 = (char *)pfVar14;
      while (0 < (long)unaff_R14) {
        puVar2 = &uStack_420 + (long)unaff_R14;
        unaff_R14 = (char *)((long)&(((fdb_kvs_handle *)((long)unaff_R14 + -0x208))->bub_ctx).handle
                            + 7);
        pfStack_460 = (fdb_doc *)0x115dc5;
        fVar5 = fdb_set((fdb_kvs_handle *)*puVar2,*(fdb_doc **)&pfVar15->kvs_config);
        if (fVar5 != FDB_RESULT_SUCCESS) {
          pfStack_460 = (fdb_doc *)0x1160c3;
          custom_seqnum_test();
          unaff_R13 = (code *)local_378;
          goto LAB_001160c3;
        }
      }
      pcVar21 = (char *)((long)&((fdb_doc *)pcVar21)->keylen + 1);
    } while ((fdb_doc *)pcVar21 != (fdb_doc *)0x5);
    unaff_R14 = (char *)0x5;
    pcVar21 = local_378;
    do {
      pcVar26 = local_378 + 0x100;
      pfStack_460 = (fdb_doc *)0x115e05;
      sprintf(pcVar26,"key%d",(ulong)unaff_R14 & 0xffffffff);
      pfStack_460 = (fdb_doc *)0x115e19;
      sprintf(pcVar21,"body%d",(ulong)unaff_R14 & 0xffffffff);
      pfVar15 = (fdb_kvs_handle *)(local_3c8 + (long)unaff_R14 * 8);
      pfStack_460 = (fdb_doc *)0x115e2c;
      sVar7 = strlen(pcVar26);
      pfStack_460 = (fdb_doc *)0x115e38;
      sVar8 = strlen(pcVar21);
      pfStack_460 = (fdb_doc *)0x115e55;
      fdb_doc_create((fdb_doc **)pfVar15,pcVar26,sVar7 + 1,(void *)0x0,0,pcVar21,sVar8 + 1);
      unaff_R15 = (fdb_iterator **)((long)unaff_R14 * 2 + 2);
      unaff_R13 = (code *)pfVar14;
      while (0 < (long)unaff_R13) {
        unaff_R12 = (char *)((long)&(((fdb_kvs_handle *)((long)unaff_R13 + -0x208))->bub_ctx).handle
                            + 7);
        pfStack_460 = (fdb_doc *)0x115e76;
        fdb_doc_set_seqnum(*(fdb_doc **)&pfVar15->kvs_config,(fdb_seqnum_t)unaff_R15);
        pfStack_460 = (fdb_doc *)0x115e83;
        fVar5 = fdb_set((fdb_kvs_handle *)(&uStack_420)[(long)unaff_R13],
                        *(fdb_doc **)&pfVar15->kvs_config);
        unaff_R13 = (code *)unaff_R12;
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001160c3;
      }
      unaff_R14 = &(((fdb_kvs_handle *)unaff_R14)->kvs_config).field_0x1;
    } while (unaff_R14 != (undefined1 *)0xa);
    uVar9 = (ulong)((int)pfVar14 - 1);
    uVar23 = uVar9;
    do {
      local_3f8 = uVar23;
      pfStack_460 = (fdb_doc *)0x115ecd;
      fdb_iterator_init((fdb_kvs_handle *)(&uStack_420)[uVar23 + 1],&local_428,(void *)0x0,0,
                        (void *)0x0,0,0);
      unaff_R12 = (char *)0x2;
      unaff_R14 = (char *)(fdb_kvs_handle *)0x0;
      pfVar12 = (fdb_doc *)pcVar21;
      do {
        pfStack_460 = (fdb_doc *)0x115ee7;
        fVar5 = fdb_iterator_get(local_428,&local_440);
        pcVar21 = (char *)local_440;
        pfVar15 = (fdb_kvs_handle *)unaff_R14;
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001160c8;
        pfVar15 = (fdb_kvs_handle *)local_440->key;
        unaff_R15 = *(fdb_iterator ***)(local_3c8 + (long)unaff_R14 * 8);
        unaff_R13 = (code *)unaff_R15[4];
        pfStack_460 = (fdb_doc *)0x115f13;
        iVar6 = bcmp(pfVar15,unaff_R13,local_440->keylen);
        if (iVar6 != 0) goto LAB_001160cd;
        pfVar15 = (fdb_kvs_handle *)((fdb_doc *)pcVar21)->body;
        unaff_R13 = (code *)unaff_R15[8];
        pfStack_460 = (fdb_doc *)0x115f32;
        iVar6 = bcmp(pfVar15,unaff_R13,((fdb_doc *)pcVar21)->bodylen);
        if (iVar6 != 0) goto LAB_001160d8;
        puVar1 = &(((fdb_kvs_handle *)unaff_R14)->kvs_config).field_0x1;
        if (unaff_R14 < (fdb_kvs_handle *)0x5) {
          if ((fdb_kvs_handle *)puVar1 != (fdb_kvs_handle *)((fdb_doc *)pcVar21)->seqnum) {
            pfStack_460 = (fdb_doc *)0x115f5a;
            custom_seqnum_test();
          }
        }
        else if ((fdb_kvs_handle *)unaff_R12 != (fdb_kvs_handle *)((fdb_doc *)pcVar21)->seqnum) {
          pfStack_460 = (fdb_doc *)0x115f87;
          custom_seqnum_test();
        }
        pfStack_460 = (fdb_doc *)0x115f6b;
        fVar5 = fdb_iterator_next(local_428);
        unaff_R12 = &(((fdb_kvs_handle *)unaff_R12)->kvs_config).field_0x2;
        unaff_R14 = puVar1;
        pfVar12 = (fdb_doc *)pcVar21;
      } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
      pfStack_460 = (fdb_doc *)0x115f93;
      fdb_iterator_close(local_428);
      pfStack_460 = (fdb_doc *)0x115fa2;
      fdb_commit(local_438,'\x01');
      uVar23 = local_3f8 - 1;
    } while (0 < (long)local_3f8);
    pfStack_460 = (fdb_doc *)0x115fc5;
    fdb_compact(local_438,"./dummy2");
    pfVar15 = (fdb_kvs_handle *)0x5;
    unaff_R14 = "key%d";
    unaff_R15 = (fdb_iterator **)(local_378 + 0x100);
    do {
      pfStack_460 = (fdb_doc *)0x115fed;
      sprintf((char *)unaff_R15,"key%d",(ulong)pfVar15 & 0xffffffff);
      unaff_R12 = (char *)((long)pfVar15 * 2 + 2);
      unaff_R13 = (code *)(uVar9 + 1);
      do {
        local_440->seqnum = (fdb_seqnum_t)unaff_R12;
        pfStack_460 = (fdb_doc *)0x11600d;
        fVar5 = fdb_get_byseq((fdb_kvs_handle *)(&uStack_420)[(long)unaff_R13],local_440);
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001160e3;
        pfVar14 = (fdb_kvs_handle *)
                  ((long)&(((fdb_kvs_handle *)((long)unaff_R13 + -0x208))->bub_ctx).handle + 7);
        bVar27 = 0 < (long)unaff_R13;
        unaff_R13 = (code *)pfVar14;
      } while (pfVar14 != (fdb_kvs_handle *)0x0 && bVar27);
      pfVar15 = (fdb_kvs_handle *)&(pfVar15->kvs_config).field_0x1;
      if (pfVar15 == (fdb_kvs_handle *)0xa) {
        pfStack_460 = (fdb_doc *)0x11602d;
        fdb_close(local_438);
        lVar16 = 0;
        do {
          pfStack_460 = (fdb_doc *)0x11603c;
          fdb_doc_free(*(fdb_doc **)(local_3c8 + lVar16 * 8));
          lVar16 = lVar16 + 1;
        } while (lVar16 != 10);
        pfStack_460 = (fdb_doc *)0x11604a;
        fdb_shutdown();
        pfStack_460 = (fdb_doc *)0x11604f;
        memleak_end();
        pcVar21 = "single kv instance";
        if ((char)local_42c != '\0') {
          pcVar21 = "multiple kv instances";
        }
        pfStack_460 = (fdb_doc *)0x11607f;
        sprintf(local_378,"Custom sequence number test %s",pcVar21);
        pcVar21 = "%s PASSED\n";
        if (custom_seqnum_test(bool)::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        pfStack_460 = (fdb_doc *)0x1160ac;
        fprintf(_stderr,pcVar21,local_378);
        return;
      }
    } while( true );
  }
  pfStack_460 = (fdb_doc *)0x115d00;
  fVar5 = fdb_kvs_open_default(local_438,local_418,(fdb_kvs_config *)local_3f0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001160f2;
  pfStack_460 = (fdb_doc *)0x115d20;
  fVar5 = fdb_set_log_callback(local_418[0],logCallbackFunc,"custom_seqnum_test");
  pfVar14 = (fdb_kvs_handle *)0x1;
  if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00115d2d;
  goto LAB_001160f7;
LAB_00116697:
  pfStack_a38 = (fdb_doc *)0x1166a2;
  doc_compression_test();
  pfVar15 = pfVar14;
LAB_001166a2:
  pfVar14 = pfVar15;
  pfStack_a38 = (fdb_doc *)0x1166a7;
  doc_compression_test();
LAB_001166a7:
  pfStack_a38 = (fdb_doc *)0x1166b2;
  doc_compression_test();
  pfVar15 = pfVar14;
LAB_001166b2:
  ppfVar13 = &pfStack_a28;
  pfStack_a38 = (fdb_doc *)0x1166b7;
  doc_compression_test();
  goto LAB_001166b7;
LAB_001171b8:
  pfStack_16a8 = (fdb_doc *)0x1171bd;
  purge_logically_deleted_doc_test();
LAB_001171bd:
  pfVar18 = pfVar12;
  pfStack_16a8 = (fdb_doc *)0x1171c2;
  purge_logically_deleted_doc_test();
LAB_001171c2:
  pfStack_16a8 = (fdb_doc *)0x1171c7;
  purge_logically_deleted_doc_test();
LAB_001171c7:
  pfStack_16a8 = (fdb_doc *)0x1171d2;
  purge_logically_deleted_doc_test();
LAB_001171d2:
  pfStack_16a8 = (fdb_doc *)0x1171d7;
  purge_logically_deleted_doc_test();
LAB_001171d7:
  pfStack_16a8 = (fdb_doc *)0x1171e2;
  purge_logically_deleted_doc_test();
  pfVar15 = pfVar14;
  pfVar12 = pfVar18;
LAB_001171e2:
  pfStack_16a8 = (fdb_doc *)0x1171e7;
  purge_logically_deleted_doc_test();
  goto LAB_001171e7;
LAB_001174ec:
  pfStack_1b30 = (fdb_doc *)0x1174fc;
  api_wrapper_test();
LAB_001174fc:
  pfStack_1b30 = (fdb_doc *)0x117501;
  api_wrapper_test();
LAB_00117501:
  pfVar14 = (fdb_kvs_handle *)(auStack_1af0 + 0x18);
  pfStack_1b30 = (fdb_doc *)0x117506;
  api_wrapper_test();
  goto LAB_00117506;
LAB_00118042:
  pfStack_2590 = (fdb_encryption_key *)0x118052;
  flush_before_commit_multi_writers_test();
  pfVar18 = pfVar12;
  goto LAB_00118052;
LAB_00118398:
  pfStack_2908 = (fdb_encryption_key *)0x1183a5;
  auto_commit_test();
  pfVar14 = (fdb_kvs_handle *)pcVar21;
LAB_001183a5:
  pcVar21 = (char *)pfVar14;
  pfStack_2908 = (fdb_encryption_key *)0x1183aa;
  auto_commit_test();
LAB_001183aa:
  pfStack_2908 = (fdb_encryption_key *)0x1183b7;
  auto_commit_test();
  pfVar14 = (fdb_kvs_handle *)pcVar21;
LAB_001183b7:
  pfVar12 = afStack_27b0;
  ppfVar13 = apfStack_28b0;
  pfStack_2908 = (fdb_encryption_key *)0x1183bc;
  auto_commit_test();
  goto LAB_001183bc;
LAB_0011968a:
  pfStack_1d858 = (fdb_kvs_handle *)0x11968f;
  open_multi_files_kvs_test();
LAB_0011968f:
  pfStack_1d858 = (fdb_kvs_handle *)0x119694;
  open_multi_files_kvs_test();
LAB_00119694:
  pfStack_1d858 = (fdb_kvs_handle *)0x119699;
  open_multi_files_kvs_test();
LAB_00119699:
  pfStack_1d858 = (fdb_kvs_handle *)0x11969e;
  open_multi_files_kvs_test();
  pfVar15 = (fdb_kvs_handle *)pcVar26;
LAB_0011969e:
  pfStack_1d858 = (fdb_kvs_handle *)0x1196a3;
  open_multi_files_kvs_test();
LAB_001196a3:
  pfStack_1d858 = (fdb_kvs_handle *)0x1196a8;
  open_multi_files_kvs_test();
LAB_001196a8:
  pfStack_1d858 = (fdb_kvs_handle *)0x1196ad;
  open_multi_files_kvs_test();
LAB_001196ad:
  pfStack_1d858 = (fdb_kvs_handle *)0x1196b2;
  open_multi_files_kvs_test();
LAB_001196b2:
  pfStack_1d858 = (fdb_kvs_handle *)0x1196b7;
  open_multi_files_kvs_test();
  goto LAB_001196b7;
LAB_00119c56:
  rekey_test();
  goto LAB_00119c66;
LAB_001160c3:
  pfStack_460 = (fdb_doc *)0x1160c8;
  custom_seqnum_test();
  pfVar12 = (fdb_doc *)pcVar21;
LAB_001160c8:
  pcVar21 = (char *)pfVar12;
  pfStack_460 = (fdb_doc *)0x1160cd;
  custom_seqnum_test();
LAB_001160cd:
  pfStack_460 = (fdb_doc *)0x1160d8;
  custom_seqnum_test();
LAB_001160d8:
  pfStack_460 = (fdb_doc *)0x1160e3;
  custom_seqnum_test();
LAB_001160e3:
  pfStack_460 = (fdb_doc *)0x1160e8;
  custom_seqnum_test();
LAB_001160e8:
  pfStack_460 = (fdb_doc *)0x1160ed;
  custom_seqnum_test();
LAB_001160ed:
  pfStack_460 = (fdb_doc *)0x1160f2;
  custom_seqnum_test();
LAB_001160f2:
  pfStack_460 = (fdb_doc *)0x1160f7;
  custom_seqnum_test();
LAB_001160f7:
  pfStack_460 = (fdb_doc *)doc_compression_test;
  custom_seqnum_test();
  pfStack_a38 = (fdb_doc *)0x11611f;
  pfStack_488 = pfVar15;
  pfStack_480 = (fdb_kvs_handle *)unaff_R12;
  pfStack_478 = (fdb_kvs_handle *)unaff_R13;
  pfStack_470 = (fdb_kvs_handle *)unaff_R14;
  ppfStack_468 = unaff_R15;
  pfStack_460 = (fdb_doc *)pcVar21;
  gettimeofday((timeval *)(auStack_9b8 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_a38 = (fdb_doc *)0x116124;
  memleak_start();
  pfStack_a28 = (fdb_kvs_handle *)0x0;
  pfStack_a38 = (fdb_doc *)0x116135;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_a38 = (fdb_doc *)0x116145;
  fdb_get_default_config();
  pfVar15 = (fdb_kvs_handle *)auStack_9b8;
  pfStack_a38 = (fdb_doc *)0x116152;
  fdb_get_default_kvs_config();
  fStack_688.buffercache_size = 0;
  fStack_688.wal_threshold = 0x400;
  fStack_688.flags = 1;
  fStack_688.compress_document_body = true;
  fStack_688.compaction_threshold = '\0';
  fStack_688.purging_interval = 1;
  pbVar10 = (btree *)(auStack_a20 + 8);
  pfStack_a38 = (fdb_doc *)0x116188;
  fdb_open((fdb_file_handle **)pbVar10,"./dummy1",&fStack_688);
  ppfVar13 = (fdb_kvs_handle **)auStack_a20;
  pfStack_a38 = (fdb_doc *)0x11619b;
  fdb_kvs_open_default((fdb_file_handle *)auStack_a20._8_8_,ppfVar13,(fdb_kvs_config *)pfVar15);
  pfStack_a38 = (fdb_doc *)0x1161b1;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_a20._0_8_,logCallbackFunc,"doc_compression_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    uStack_880 = 0x6161616161616161;
    psStack_878 = (snap_handle *)0x6161616161616161;
    uStack_890 = 0x6161616161616161;
    uStack_888 = 0x6161616161616161;
    uStack_870 = uStack_870 & 0xffffff00;
    unaff_R13 = (code *)0x0;
    uVar23 = 0;
    do {
      pfStack_a38 = (fdb_doc *)0x1161f5;
      sprintf(acStack_590,"key%d",uVar23 & 0xffffffff);
      pfStack_a38 = (fdb_doc *)0x11620e;
      sprintf(acStack_790,"meta%d",uVar23 & 0xffffffff);
      pfStack_a38 = (fdb_doc *)0x11622f;
      sprintf(auStack_990,"body%d_%s",uVar23 & 0xffffffff,&uStack_890);
      unaff_R12 = auStack_a10 + (long)unaff_R13;
      pfStack_a38 = (fdb_doc *)0x11623f;
      pcVar21 = (char *)strlen(acStack_590);
      pfStack_a38 = (fdb_doc *)0x116252;
      pbVar10 = (btree *)strlen(acStack_790);
      pfStack_a38 = (fdb_doc *)0x116262;
      sVar7 = strlen(auStack_990);
      pfStack_a38 = (fdb_doc *)0x116287;
      fdb_doc_create((fdb_doc **)unaff_R12,acStack_590,(size_t)pcVar21,acStack_790,(size_t)pbVar10,
                     auStack_990,sVar7);
      pfStack_a38 = (fdb_doc *)0x116296;
      fdb_set((fdb_kvs_handle *)auStack_a20._0_8_,*(fdb_doc **)(auStack_a10 + uVar23 * 8));
      uVar23 = uVar23 + 1;
      unaff_R13 = (code *)((long)unaff_R13 + 8);
    } while (uVar23 != 10);
    keylen._0_1_ = pbStack_9e8->ksize;
    keylen._1_1_ = pbStack_9e8->vsize;
    keylen._2_2_ = pbStack_9e8->height;
    keylen._4_4_ = pbStack_9e8->blksize;
    ppfVar13 = &pfStack_a28;
    pfStack_a38 = (fdb_doc *)0x1162d3;
    fdb_doc_create((fdb_doc **)ppfVar13,pbStack_9e8->kv_ops,keylen,*(void **)(pbStack_9e8 + 1),
                   pbStack_9e8->root_bid,(void *)0x0,0);
    pfStack_a38 = (fdb_doc *)0x1162e0;
    fVar5 = fdb_del((fdb_kvs_handle *)auStack_a20._0_8_,(fdb_doc *)pfStack_a28);
    pfVar15 = (fdb_kvs_handle *)0xa;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001166bc;
    pfStack_a38 = (fdb_doc *)0x1162f2;
    fdb_doc_free((fdb_doc *)pfStack_a28);
    pfStack_a28 = (fdb_kvs_handle *)0x0;
    ppfVar13 = (fdb_kvs_handle **)(auStack_a20 + 8);
    pfStack_a38 = (fdb_doc *)0x11630a;
    fdb_commit((fdb_file_handle *)auStack_a20._8_8_,'\0');
    pfVar15 = (fdb_kvs_handle *)auStack_a20;
    pfStack_a38 = (fdb_doc *)0x116317;
    fdb_kvs_close((fdb_kvs_handle *)auStack_a20._0_8_);
    pfStack_a38 = (fdb_doc *)0x11631f;
    fdb_close((fdb_file_handle *)auStack_a20._8_8_);
    pfStack_a38 = (fdb_doc *)0x116336;
    fdb_open((fdb_file_handle **)ppfVar13,"./dummy1",&fStack_688);
    pfStack_a38 = (fdb_doc *)0x116346;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_a20._8_8_,(fdb_kvs_handle **)pfVar15,
               (fdb_kvs_config *)auStack_9b8);
    pfStack_a38 = (fdb_doc *)0x11635c;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_a20._0_8_,logCallbackFunc,"doc_compression_test");
    if (fVar5 == FDB_RESULT_SUCCESS) {
      uStack_860 = 0x62626262;
      uStack_85c = 0x62626262;
      uStack_858 = 0x62626262;
      uStack_854 = 0x62626262;
      uStack_870 = 0x62626262;
      uStack_86c = 0x62626262;
      uStack_868 = 0x62626262;
      uStack_864 = 0x62626262;
      uStack_880 = 0x6262626262626262;
      psStack_878 = (snap_handle *)0x6262626262626262;
      uStack_890 = 0x6262626262626262;
      uStack_888 = 0x6262626262626262;
      aStack_850.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)'\0';
      unaff_R13 = (code *)0x0;
      pfStack_a38 = (fdb_doc *)0x1163a9;
      sprintf(acStack_790,"newmeta%d",0);
      pfStack_a38 = (fdb_doc *)0x1163c7;
      sprintf((char *)auStack_990,"newbody%d_%s",0,&uStack_890);
      pfStack_a38 = (fdb_doc *)0x1163cf;
      pcVar21 = (char *)strlen(acStack_790);
      pfStack_a38 = (fdb_doc *)0x1163da;
      sVar7 = strlen((char *)auStack_990);
      pfStack_a38 = (fdb_doc *)0x1163f3;
      fdb_doc_update((fdb_doc **)auStack_a10,acStack_790,(size_t)pcVar21,
                     (fdb_kvs_handle *)auStack_990,sVar7);
      pfStack_a38 = (fdb_doc *)0x116401;
      fdb_set((fdb_kvs_handle *)auStack_a20._0_8_,(fdb_doc *)auStack_a10._0_8_);
      pfStack_a38 = (fdb_doc *)0x116417;
      sprintf(acStack_790,"newmeta%d",1);
      pfStack_a38 = (fdb_doc *)0x116430;
      sprintf((char *)auStack_990,"newbody%d_%s",1,&uStack_890);
      pbVar10 = (btree *)(auStack_a10 + 8);
      pfStack_a38 = (fdb_doc *)0x11643d;
      unaff_R12 = (char *)strlen(acStack_790);
      pfStack_a38 = (fdb_doc *)0x116448;
      sVar7 = strlen((char *)auStack_990);
      pfStack_a38 = (fdb_doc *)0x11645c;
      fdb_doc_update((fdb_doc **)pbVar10,acStack_790,(size_t)unaff_R12,(fdb_kvs_handle *)auStack_990
                     ,sVar7);
      pfStack_a38 = (fdb_doc *)0x116469;
      fdb_set((fdb_kvs_handle *)auStack_a20._0_8_,(fdb_doc *)auStack_a10._8_8_);
      pfStack_a38 = (fdb_doc *)0x116475;
      fdb_commit((fdb_file_handle *)auStack_a20._8_8_,'\0');
      pfVar14 = (fdb_kvs_handle *)auStack_990;
      do {
        pfStack_a38 = (fdb_doc *)0x11649e;
        fdb_doc_create((fdb_doc **)&pfStack_a28,
                       (void *)(*(size_t **)(auStack_a10 + (long)unaff_R13 * 8))[4],
                       **(size_t **)(auStack_a10 + (long)unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0)
        ;
        pfStack_a38 = (fdb_doc *)0x1164ad;
        fVar5 = fdb_get((fdb_kvs_handle *)auStack_a20._0_8_,(fdb_doc *)pfStack_a28);
        pfVar15 = pfStack_a28;
        if ((fdb_kvs_handle *)unaff_R13 != (fdb_kvs_handle *)0x5) {
          if (fVar5 == FDB_RESULT_SUCCESS) {
            pbVar10 = pfStack_a28->staletree;
            pcVar21 = *(char **)(auStack_a10 + (long)unaff_R13 * 8);
            unaff_R12 = (char *)((fdb_doc *)pcVar21)->meta;
            pfStack_a38 = (fdb_doc *)0x1164ec;
            iVar6 = bcmp(pbVar10,unaff_R12,(size_t)(pfStack_a28->kvs_config).custom_cmp);
            if (iVar6 == 0) {
              pbVar10 = (pfVar15->field_6).seqtree;
              unaff_R12 = (char *)((fdb_doc *)pcVar21)->body;
              pfStack_a38 = (fdb_doc *)0x11650b;
              iVar6 = bcmp(pbVar10,unaff_R12,(size_t)(pfVar15->kvs_config).custom_cmp_param);
              if (iVar6 == 0) goto LAB_00116513;
              pfStack_a38 = (fdb_doc *)0x116682;
              doc_compression_test();
              pfVar14 = pfVar15;
              goto LAB_00116682;
            }
          }
          else {
LAB_00116682:
            pfVar15 = pfVar14;
            pfStack_a38 = (fdb_doc *)0x116687;
            doc_compression_test();
          }
          pfStack_a38 = (fdb_doc *)0x116692;
          doc_compression_test();
          pfVar14 = pfVar15;
LAB_00116692:
          pfStack_a38 = (fdb_doc *)0x116697;
          doc_compression_test();
          goto LAB_00116697;
        }
        if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116692;
LAB_00116513:
        pfStack_a38 = (fdb_doc *)0x11651b;
        fdb_doc_free((fdb_doc *)pfVar15);
        pfStack_a28 = (fdb_kvs_handle *)0x0;
        unaff_R13 = (code *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
        pfVar14 = pfVar15;
      } while (unaff_R13 != (code *)0xa);
      pfStack_a38 = (fdb_doc *)0x116542;
      fdb_compact((fdb_file_handle *)auStack_a20._8_8_,"./dummy2");
      unaff_R13 = (code *)0x0;
      do {
        pfStack_a38 = (fdb_doc *)0x11656e;
        fdb_doc_create((fdb_doc **)&pfStack_a28,
                       (void *)(*(size_t **)(auStack_a10 + (long)unaff_R13 * 8))[4],
                       **(size_t **)(auStack_a10 + (long)unaff_R13 * 8),(void *)0x0,0,(void *)0x0,0)
        ;
        pfStack_a38 = (fdb_doc *)0x11657d;
        fVar5 = fdb_get((fdb_kvs_handle *)auStack_a20._0_8_,(fdb_doc *)pfStack_a28);
        pfVar14 = pfStack_a28;
        if ((fdb_kvs_handle *)unaff_R13 == (fdb_kvs_handle *)0x5) {
          if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001166b2;
        }
        else {
          if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001166a2;
          pbVar10 = pfStack_a28->staletree;
          pcVar21 = *(char **)(auStack_a10 + (long)unaff_R13 * 8);
          unaff_R12 = (char *)((fdb_doc *)pcVar21)->meta;
          pfStack_a38 = (fdb_doc *)0x1165bc;
          iVar6 = bcmp(pbVar10,unaff_R12,(size_t)(pfStack_a28->kvs_config).custom_cmp);
          if (iVar6 != 0) goto LAB_001166a7;
          pbVar10 = (pfVar14->field_6).seqtree;
          unaff_R12 = (char *)((fdb_doc *)pcVar21)->body;
          pfStack_a38 = (fdb_doc *)0x1165db;
          iVar6 = bcmp(pbVar10,unaff_R12,(size_t)(pfVar14->kvs_config).custom_cmp_param);
          if (iVar6 != 0) goto LAB_00116697;
        }
        pfStack_a38 = (fdb_doc *)0x1165eb;
        fdb_doc_free((fdb_doc *)pfVar14);
        pfStack_a28 = (fdb_kvs_handle *)0x0;
        unaff_R13 = (code *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
        pfVar15 = pfVar14;
        if (unaff_R13 == (code *)0xa) {
          lVar16 = 0;
          do {
            pfStack_a38 = (fdb_doc *)0x11660d;
            fdb_doc_free(*(fdb_doc **)(auStack_a10 + lVar16 * 8));
            lVar16 = lVar16 + 1;
          } while (lVar16 != 10);
          pfStack_a38 = (fdb_doc *)0x116620;
          fdb_kvs_close((fdb_kvs_handle *)auStack_a20._0_8_);
          pfStack_a38 = (fdb_doc *)0x11662a;
          fdb_close((fdb_file_handle *)auStack_a20._8_8_);
          pfStack_a38 = (fdb_doc *)0x11662f;
          fdb_shutdown();
          pfStack_a38 = (fdb_doc *)0x116634;
          memleak_end();
          pcVar21 = "%s PASSED\n";
          if (doc_compression_test()::__test_pass != '\0') {
            pcVar21 = "%s FAILED\n";
          }
          pfStack_a38 = (fdb_doc *)0x116665;
          fprintf(_stderr,pcVar21,"document compression test");
          return;
        }
      } while( true );
    }
  }
  else {
LAB_001166b7:
    pfStack_a38 = (fdb_doc *)0x1166bc;
    doc_compression_test();
LAB_001166bc:
    pfStack_a38 = (fdb_doc *)0x1166c1;
    doc_compression_test();
  }
  pfStack_a38 = (fdb_doc *)read_doc_by_offset_test;
  doc_compression_test();
  pfStack_11e0 = (fdb_doc *)0x1166e3;
  ppfStack_a60 = ppfVar13;
  pfStack_a58 = (fdb_kvs_handle *)unaff_R12;
  pfStack_a50 = (fdb_kvs_handle *)unaff_R13;
  pfStack_a48 = pfVar15;
  pbStack_a40 = pbVar10;
  pfStack_a38 = (fdb_doc *)pcVar21;
  gettimeofday(&tStack_11a0,(__timezone_ptr_t)0x0);
  pfStack_11e0 = (fdb_doc *)0x1166e8;
  memleak_start();
  pfStack_11e0 = (fdb_doc *)0x1166f4;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_11e0 = (fdb_doc *)0x116704;
  fdb_get_default_config();
  pbVar10 = (btree *)auStack_1190;
  pfStack_11e0 = (fdb_doc *)0x116711;
  fdb_get_default_kvs_config();
  fStack_b58.buffercache_size = 0;
  fStack_b58.wal_threshold = 0x400;
  fStack_b58.flags = 1;
  fStack_b58.purging_interval = 0xe10;
  fStack_b58.compaction_threshold = '\0';
  pfVar12 = (fdb_doc *)auStack_11b8;
  pfStack_11e0 = (fdb_doc *)0x11674a;
  fdb_open((fdb_file_handle **)pfVar12,"./dummy1",&fStack_b58);
  pfVar18 = (fdb_doc *)(auStack_11c8 + 8);
  pfStack_11e0 = (fdb_doc *)0x11675d;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_11b8._0_8_,(fdb_kvs_handle **)pfVar18,
             (fdb_kvs_config *)pbVar10);
  pfStack_11e0 = (fdb_doc *)0x116773;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_11c8._8_8_,logCallbackFunc,"read_doc_by_offset_test")
  ;
  if (fVar5 == FDB_RESULT_SUCCESS) {
    lVar16 = 0;
    uVar23 = 0;
    do {
      pfStack_11e0 = (fdb_doc *)0x11679b;
      sprintf(acStack_c58,"key%d",uVar23 & 0xffffffff);
      pfStack_11e0 = (fdb_doc *)0x1167b3;
      sprintf((char *)abStack_d58,"meta%d",uVar23 & 0xffffffff);
      pfStack_11e0 = (fdb_doc *)0x1167c8;
      sprintf(auStack_1190 + 0x18,"body%d",uVar23 & 0xffffffff);
      pfStack_11e0 = (fdb_doc *)0x1167db;
      sVar7 = strlen(acStack_c58);
      pfStack_11e0 = (fdb_doc *)0x1167ee;
      sVar8 = strlen((char *)abStack_d58);
      pfStack_11e0 = (fdb_doc *)0x1167fb;
      sVar11 = strlen(auStack_1190 + 0x18);
      pfStack_11e0 = (fdb_doc *)0x11681d;
      fdb_doc_create((fdb_doc **)((long)&afStack_1078[0].keylen + lVar16),acStack_c58,sVar7,
                     abStack_d58,sVar8,auStack_1190 + 0x18,sVar11);
      pfStack_11e0 = (fdb_doc *)0x11682f;
      fdb_set((fdb_kvs_handle *)auStack_11c8._8_8_,(fdb_doc *)(&afStack_1078[0].keylen)[uVar23]);
      uVar23 = uVar23 + 1;
      lVar16 = lVar16 + 8;
    } while (uVar23 != 100);
    pfStack_11e0 = (fdb_doc *)0x11684c;
    fdb_commit((fdb_file_handle *)auStack_11b8._0_8_,'\0');
    pbVar10 = abStack_d58;
    unaff_R12 = auStack_1190 + 0x18;
    pfVar12 = (fdb_doc *)0x0;
    uVar23 = 0;
    do {
      pfStack_11e0 = (fdb_doc *)0x116873;
      sprintf((char *)pbVar10,"meta2%d",uVar23 & 0xffffffff);
      pfStack_11e0 = (fdb_doc *)0x116887;
      sprintf(unaff_R12,"body2%d",uVar23 & 0xffffffff);
      pcVar21 = (char *)((long)&afStack_1078[0].keylen + (long)pfVar12);
      pfStack_11e0 = (fdb_doc *)0x11689a;
      sVar7 = strlen((char *)pbVar10);
      pfStack_11e0 = (fdb_doc *)0x1168a5;
      sVar8 = strlen(unaff_R12);
      pfStack_11e0 = (fdb_doc *)0x1168b9;
      fdb_doc_update((fdb_doc **)pcVar21,pbVar10,sVar7,unaff_R12,sVar8);
      pfStack_11e0 = (fdb_doc *)0x1168cb;
      fdb_set((fdb_kvs_handle *)auStack_11c8._8_8_,(fdb_doc *)(&afStack_1078[0].keylen)[uVar23]);
      uVar23 = uVar23 + 1;
      pfVar12 = (fdb_doc *)((long)pfVar12 + 8);
    } while (uVar23 != 0x32);
    pfVar18 = (fdb_doc *)auStack_11c8;
    pfStack_11e0 = (fdb_doc *)0x116907;
    fdb_doc_create((fdb_doc **)pfVar18,(void *)psStack_ee8[4],*psStack_ee8,(void *)psStack_ee8[7],
                   psStack_ee8[1],(void *)0x0,0);
    pfStack_11e0 = (fdb_doc *)0x116914;
    fVar5 = fdb_del((fdb_kvs_handle *)auStack_11c8._8_8_,(fdb_doc *)auStack_11c8._0_8_);
    unaff_R13 = (code *)0x32;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00116c56;
    pfVar18 = (fdb_doc *)auStack_11c8;
    pfStack_11e0 = (fdb_doc *)0x116929;
    fdb_doc_free((fdb_doc *)auStack_11c8._0_8_);
    pbVar10 = (btree *)0x0;
    auStack_11c8._0_8_ = (fdb_doc *)0x0;
    pfStack_11e0 = (fdb_doc *)0x11693b;
    fdb_commit((fdb_file_handle *)auStack_11b8._0_8_,'\0');
    pfStack_11e0 = (fdb_doc *)0x11695e;
    fdb_doc_create((fdb_doc **)pfVar18,*(kvs_ops_stat **)(afStack_1078[0].seqnum + 0x20),
                   *(size_t *)(fdb_kvs_config *)afStack_1078[0].seqnum,(void *)0x0,0,(void *)0x0,0);
    pfStack_11e0 = (fdb_doc *)0x11696b;
    fVar5 = fdb_get_metaonly((fdb_kvs_handle *)auStack_11c8._8_8_,(fdb_doc *)auStack_11c8._0_8_);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00116c5b;
    pfVar18 = (fdb_doc *)auStack_11c8._0_8_;
    if (*(bool *)(auStack_11c8._0_8_ + 0x48) != false) {
      pfStack_11e0 = (fdb_doc *)0x116990;
      read_doc_by_offset_test();
      pfVar18 = (fdb_doc *)auStack_11b8._8_8_;
    }
    pbVar10 = (btree *)pfVar18->meta;
    pfVar12 = *(fdb_doc **)(afStack_1078[0].seqnum + 0x38);
    pfStack_11e0 = (fdb_doc *)0x1169b2;
    iVar6 = bcmp(pbVar10,pfVar12,pfVar18->metalen);
    if (iVar6 != 0) goto LAB_00116c60;
    pfStack_11e0 = (fdb_doc *)0x1169c7;
    fVar5 = fdb_get_byoffset((fdb_kvs_handle *)auStack_11c8._8_8_,pfVar18);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00116c6b;
    pfVar12 = (fdb_doc *)auStack_11c8._0_8_;
    if (*(bool *)(auStack_11c8._0_8_ + 0x48) != false) {
      pfStack_11e0 = (fdb_doc *)0x1169ed;
      read_doc_by_offset_test();
      pfVar12 = (fdb_doc *)auStack_11b8._8_8_;
    }
    unaff_R12 = (char *)afStack_1078[0].seqnum;
    pfVar18 = (fdb_doc *)pfVar12->meta;
    pbVar10 = *(btree **)(afStack_1078[0].seqnum + 0x38);
    pfStack_11e0 = (fdb_doc *)0x116a10;
    iVar6 = bcmp(pfVar18,pbVar10,pfVar12->metalen);
    if (iVar6 != 0) goto LAB_00116c70;
    pfVar18 = (fdb_doc *)pfVar12->body;
    pbVar10 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)unaff_R12 + 0x40))->seqtree;
    pfStack_11e0 = (fdb_doc *)0x116a30;
    iVar6 = bcmp(pfVar18,pbVar10,pfVar12->bodylen);
    if (iVar6 != 0) goto LAB_00116c7b;
    pfVar18 = (fdb_doc *)(auStack_11b8 + 0x10);
    pfStack_11e0 = (fdb_doc *)0x116a59;
    fdb_doc_create((fdb_doc **)pfVar18,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    *(uint64_t *)(auStack_11b8._16_8_ + 0x30) = *(uint64_t *)(auStack_11c8._0_8_ + 0x30);
    pfStack_11e0 = (fdb_doc *)0x116a73;
    fVar5 = fdb_get_byoffset((fdb_kvs_handle *)auStack_11c8._8_8_,(fdb_doc *)auStack_11b8._16_8_);
    pfVar24 = (fdb_doc *)auStack_11b8._16_8_;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00116c86;
    pfVar18 = *(fdb_doc **)(auStack_11b8._16_8_ + 0x20);
    pbVar10 = *(btree **)(afStack_1078[0].seqnum + 0x20);
    pfStack_11e0 = (fdb_doc *)0x116a9f;
    iVar6 = bcmp(pfVar18,pbVar10,(size_t)*(size_t *)auStack_11b8._16_8_);
    unaff_R12 = (char *)afStack_1078[0].seqnum;
    if (iVar6 != 0) goto LAB_00116c8b;
    pfVar18 = *(fdb_doc **)((long)pfVar24 + 0x38);
    pbVar10 = *(btree **)(afStack_1078[0].seqnum + 0x38);
    pfStack_11e0 = (fdb_doc *)0x116abf;
    iVar6 = bcmp(pfVar18,pbVar10,*(size_t *)((long)pfVar24 + 8));
    if (iVar6 != 0) goto LAB_00116c96;
    pfVar18 = *(fdb_doc **)((long)pfVar24 + 0x40);
    pbVar10 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(afStack_1078[0].seqnum + 0x40))->
              seqtree;
    pfStack_11e0 = (fdb_doc *)0x116adf;
    iVar6 = bcmp(pfVar18,pbVar10,*(size_t *)((long)pfVar24 + 0x10));
    if (iVar6 != 0) goto LAB_00116ca1;
    pfVar18 = (fdb_doc *)auStack_11c8;
    pfStack_11e0 = (fdb_doc *)0x116af4;
    fdb_doc_free((fdb_doc *)auStack_11c8._0_8_);
    pbVar10 = (btree *)0x0;
    auStack_11c8._0_8_ = (fdb_doc *)0x0;
    pfStack_11e0 = (fdb_doc *)0x116b04;
    fdb_doc_free((fdb_doc *)auStack_11b8._16_8_);
    pfStack_11e0 = (fdb_doc *)0x116b15;
    fdb_compact((fdb_file_handle *)auStack_11b8._0_8_,"./dummy2");
    pfStack_11e0 = (fdb_doc *)0x116b38;
    fdb_doc_create((fdb_doc **)pfVar18,(void *)psStack_ee8[4],*psStack_ee8,(void *)0x0,0,(void *)0x0
                   ,0);
    pfStack_11e0 = (fdb_doc *)0x116b45;
    fVar5 = fdb_get_metaonly((fdb_kvs_handle *)auStack_11c8._8_8_,(fdb_doc *)auStack_11c8._0_8_);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00116cac;
    pfVar18 = (fdb_doc *)auStack_11c8._0_8_;
    if (*(bool *)(auStack_11c8._0_8_ + 0x48) == false) {
      pfStack_11e0 = (fdb_doc *)0x116b6a;
      read_doc_by_offset_test();
      pfVar18 = (fdb_doc *)auStack_11b8._8_8_;
    }
    pbVar10 = (btree *)pfVar18->meta;
    pfVar24 = (fdb_doc *)psStack_ee8[7];
    pfStack_11e0 = (fdb_doc *)0x116b8c;
    iVar6 = bcmp(pbVar10,pfVar24,pfVar18->metalen);
    if (iVar6 != 0) goto LAB_00116cb1;
    pfStack_11e0 = (fdb_doc *)0x116ba1;
    fVar5 = fdb_get_byoffset((fdb_kvs_handle *)auStack_11c8._8_8_,pfVar18);
    if (fVar5 == FDB_RESULT_KEY_NOT_FOUND) {
      pfVar12 = (fdb_doc *)auStack_11c8._0_8_;
      if (*(bool *)(auStack_11c8._0_8_ + 0x48) == false) {
        pfStack_11e0 = (fdb_doc *)0x116bc7;
        read_doc_by_offset_test();
        pfVar12 = (fdb_doc *)auStack_11b8._8_8_;
      }
      pfStack_11e0 = (fdb_doc *)0x116bcf;
      fdb_doc_free(pfVar12);
      auStack_11c8._0_8_ = 0;
      lVar16 = 0;
      do {
        pfStack_11e0 = (fdb_doc *)0x116be7;
        fdb_doc_free((fdb_doc *)(&afStack_1078[0].keylen)[lVar16]);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 100);
      pfStack_11e0 = (fdb_doc *)0x116bfa;
      fdb_kvs_close((fdb_kvs_handle *)auStack_11c8._8_8_);
      pfStack_11e0 = (fdb_doc *)0x116c04;
      fdb_close((fdb_file_handle *)auStack_11b8._0_8_);
      pfStack_11e0 = (fdb_doc *)0x116c09;
      fdb_shutdown();
      pfStack_11e0 = (fdb_doc *)0x116c0e;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (read_doc_by_offset_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_11e0 = (fdb_doc *)0x116c3f;
      fprintf(_stderr,pcVar21,"read_doc_by_offset test");
      return;
    }
  }
  else {
    pfStack_11e0 = (fdb_doc *)0x116c56;
    read_doc_by_offset_test();
LAB_00116c56:
    pfStack_11e0 = (fdb_doc *)0x116c5b;
    read_doc_by_offset_test();
LAB_00116c5b:
    pfStack_11e0 = (fdb_doc *)0x116c60;
    read_doc_by_offset_test();
LAB_00116c60:
    pfStack_11e0 = (fdb_doc *)0x116c6b;
    read_doc_by_offset_test();
LAB_00116c6b:
    pfStack_11e0 = (fdb_doc *)0x116c70;
    read_doc_by_offset_test();
LAB_00116c70:
    pfStack_11e0 = (fdb_doc *)0x116c7b;
    read_doc_by_offset_test();
LAB_00116c7b:
    pfStack_11e0 = (fdb_doc *)0x116c86;
    read_doc_by_offset_test();
LAB_00116c86:
    pfVar24 = pfVar12;
    pfStack_11e0 = (fdb_doc *)0x116c8b;
    read_doc_by_offset_test();
LAB_00116c8b:
    pfStack_11e0 = (fdb_doc *)0x116c96;
    read_doc_by_offset_test();
LAB_00116c96:
    pfStack_11e0 = (fdb_doc *)0x116ca1;
    read_doc_by_offset_test();
LAB_00116ca1:
    pfStack_11e0 = (fdb_doc *)0x116cac;
    read_doc_by_offset_test();
LAB_00116cac:
    pfStack_11e0 = (fdb_doc *)0x116cb1;
    read_doc_by_offset_test();
LAB_00116cb1:
    pfStack_11e0 = (fdb_doc *)0x116cbc;
    read_doc_by_offset_test();
  }
  pfStack_11e0 = (fdb_doc *)purge_logically_deleted_doc_test;
  read_doc_by_offset_test();
  pfStack_16a8 = (fdb_doc *)0x116ce1;
  pfStack_1208 = pfVar18;
  pfStack_1200 = (fdb_kvs_handle *)unaff_R12;
  pfStack_11f8 = (fdb_kvs_handle *)unaff_R13;
  pbStack_11f0 = pbVar10;
  pfStack_11e8 = pfVar24;
  pfStack_11e0 = (fdb_doc *)pcVar21;
  gettimeofday(&tStack_1628,(__timezone_ptr_t)0x0);
  pfStack_16a8 = (fdb_doc *)0x116ce6;
  memleak_start();
  pfStack_1698 = (fdb_doc *)0x0;
  pfStack_16a8 = (fdb_doc *)0x116cf7;
  system("rm -rf  dummy* fdb_test_config.json > errorlog.txt");
  pfStack_16a8 = (fdb_doc *)0x116d07;
  fdb_get_default_config();
  pfVar12 = afStack_1618;
  pfStack_16a8 = (fdb_doc *)0x116d17;
  fdb_get_default_kvs_config();
  fStack_1300.buffercache_size = 0;
  fStack_1300.wal_threshold = 0x400;
  fStack_1300.flags = 1;
  fStack_1300.purging_interval = 2;
  fStack_1300.compaction_threshold = '\0';
  ppfVar25 = &pfStack_1688;
  pfStack_16a8 = (fdb_doc *)0x116d4c;
  fdb_open((fdb_file_handle **)ppfVar25,"./dummy1",&fStack_1300);
  pfVar15 = (fdb_kvs_handle *)&pfStack_1690;
  pfStack_16a8 = (fdb_doc *)0x116d5f;
  fdb_kvs_open_default
            ((fdb_file_handle *)pfStack_1688,(fdb_kvs_handle **)pfVar15,(fdb_kvs_config *)pfVar12);
  pfStack_16a8 = (fdb_doc *)0x116d75;
  fVar5 = fdb_set_log_callback(pfStack_1690,logCallbackFunc,"purge_logically_deleted_doc_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (char *)0x0;
    uVar23 = 0;
    do {
      pfStack_16a8 = (fdb_doc *)0x116d9d;
      sprintf(acStack_1400,"key%d",uVar23 & 0xffffffff);
      pfStack_16a8 = (fdb_doc *)0x116db5;
      sprintf((char *)afStack_1500,"meta%d",uVar23 & 0xffffffff);
      pfStack_16a8 = (fdb_doc *)0x116dcd;
      sprintf((char *)&afStack_1618[0].size_ondisk,"body%d",uVar23 & 0xffffffff);
      ppfVar25 = (fdb_doc **)((long)apfStack_1680 + (long)unaff_R12);
      pfStack_16a8 = (fdb_doc *)0x116ddd;
      unaff_R13 = (code *)strlen(acStack_1400);
      pcVar21 = (char *)afStack_1500;
      pfStack_16a8 = (fdb_doc *)0x116df0;
      pfVar12 = (fdb_doc *)strlen(pcVar21);
      pfStack_16a8 = (fdb_doc *)0x116e00;
      sVar7 = strlen((char *)&afStack_1618[0].size_ondisk);
      pfStack_16a8 = (fdb_doc *)0x116e25;
      fdb_doc_create(ppfVar25,acStack_1400,(size_t)unaff_R13,pcVar21,(size_t)pfVar12,
                     &afStack_1618[0].size_ondisk,sVar7);
      pfStack_16a8 = (fdb_doc *)0x116e34;
      fdb_set(pfStack_1690,apfStack_1680[uVar23]);
      uVar23 = uVar23 + 1;
      unaff_R12 = (char *)((long)unaff_R12 + 8);
    } while (uVar23 != 10);
    keylen_00._0_1_ = *(uint8_t *)aStack_1658;
    keylen_00._1_1_ = *(uint8_t *)((long)aStack_1658 + 1);
    keylen_00._2_2_ = *(uint16_t *)((long)aStack_1658 + 2);
    keylen_00._4_4_ = *(uint32_t *)((long)aStack_1658 + 4);
    pfVar15 = (fdb_kvs_handle *)&pfStack_1698;
    pfStack_16a8 = (fdb_doc *)0x116e71;
    fdb_doc_create((fdb_doc **)pfVar15,(btree_kv_ops *)(aStack_1658.seqtrie)->aux,keylen_00,
                   (aStack_1658.seqtrie)->btree_leaf_kv_ops,(aStack_1658.seqtree)->root_bid,
                   (void *)0x0,0);
    pfStack_16a8 = (fdb_doc *)0x116e7e;
    fVar5 = fdb_del(pfStack_1690,pfStack_1698);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfVar15 = (fdb_kvs_handle *)&pfStack_1698;
      pfStack_16a8 = (fdb_doc *)0x116e93;
      fdb_doc_free(pfStack_1698);
      pfStack_1698 = (fdb_doc *)0x0;
      pfStack_16a8 = (fdb_doc *)0x116ea9;
      fdb_commit((fdb_file_handle *)pfStack_1688,'\0');
      pfStack_16a8 = (fdb_doc *)0x116eba;
      fdb_compact((fdb_file_handle *)pfStack_1688,"./dummy2");
      pcVar21 = (char *)0x0;
      pfVar18 = pfVar12;
      do {
        pfStack_16a8 = (fdb_doc *)0x116ee0;
        fdb_doc_create((fdb_doc **)pfVar15,apfStack_1680[(long)pcVar21]->key,
                       apfStack_1680[(long)pcVar21]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_16a8 = (fdb_doc *)0x116eef;
        fVar5 = fdb_get(pfStack_1690,pfStack_1698);
        pfVar12 = pfStack_1698;
        if ((fdb_doc *)pcVar21 != (fdb_doc *)0x5) {
          if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_001171a3:
            pfStack_16a8 = (fdb_doc *)0x1171a8;
            purge_logically_deleted_doc_test();
            goto LAB_001171a8;
          }
          ppfVar25 = (fdb_doc **)pfStack_1698->meta;
          pfVar14 = (fdb_kvs_handle *)apfStack_1680[(long)pcVar21];
          unaff_R12 = (char *)pfVar14->staletree;
          pfStack_16a8 = (fdb_doc *)0x116f31;
          iVar6 = bcmp(ppfVar25,unaff_R12,pfStack_1698->metalen);
          unaff_R13 = (code *)pfVar15;
          if (iVar6 == 0) {
            ppfVar25 = (fdb_doc **)pfVar12->body;
            unaff_R12 = (char *)(pfVar14->field_6).seqtree;
            pfStack_16a8 = (fdb_doc *)0x116f50;
            iVar6 = bcmp(ppfVar25,unaff_R12,pfVar12->bodylen);
            if (iVar6 == 0) goto LAB_00116f61;
LAB_00117198:
            pfStack_16a8 = (fdb_doc *)0x1171a3;
            purge_logically_deleted_doc_test();
            pfVar18 = pfVar12;
            goto LAB_001171a3;
          }
LAB_001171ad:
          pfStack_16a8 = (fdb_doc *)0x1171b8;
          purge_logically_deleted_doc_test();
          goto LAB_001171b8;
        }
        if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) {
LAB_001171a8:
          pfVar12 = pfVar18;
          pfStack_16a8 = (fdb_doc *)0x1171ad;
          purge_logically_deleted_doc_test();
          pfVar14 = pfVar15;
          unaff_R13 = (code *)(fdb_kvs_handle *)0x0;
          goto LAB_001171ad;
        }
LAB_00116f61:
        unaff_R13 = (code *)0x0;
        pfStack_16a8 = (fdb_doc *)0x116f69;
        fdb_doc_free(pfVar12);
        pfStack_1698 = (fdb_doc *)0x0;
        pfStack_16a8 = (fdb_doc *)0x116f8e;
        fdb_doc_create((fdb_doc **)pfVar15,apfStack_1680[(long)pcVar21]->key,
                       apfStack_1680[(long)pcVar21]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_16a8 = (fdb_doc *)0x116f9d;
        fVar5 = fdb_get_metaonly(pfStack_1690,pfStack_1698);
        if ((fdb_doc *)pcVar21 == (fdb_doc *)0x5) {
          if ((fVar5 != FDB_RESULT_KEY_NOT_FOUND) && (fVar5 != FDB_RESULT_SUCCESS))
          goto LAB_001171e2;
        }
        else if (fVar5 != FDB_RESULT_SUCCESS) {
          pfStack_16a8 = (fdb_doc *)0x117198;
          purge_logically_deleted_doc_test();
          goto LAB_00117198;
        }
        pfStack_16a8 = (fdb_doc *)0x116fc3;
        fdb_doc_free(pfStack_1698);
        pfStack_1698 = (fdb_doc *)0x0;
        pcVar21 = (char *)((long)&((fdb_doc *)pcVar21)->keylen + 1);
        pfVar18 = pfVar12;
      } while ((fdb_doc *)pcVar21 != (fdb_doc *)0xa);
      pfStack_16a8 = (fdb_doc *)0x116fe5;
      puts("wait for 3 seconds..");
      pfStack_16a8 = (fdb_doc *)0x116fef;
      sleep(3);
      pfStack_16a8 = (fdb_doc *)0x117000;
      fdb_compact((fdb_file_handle *)pfStack_1688,"./dummy3");
      pfVar14 = (fdb_kvs_handle *)&pfStack_1698;
      pcVar21 = (char *)0x0;
      do {
        unaff_R13 = (code *)0x0;
        pfStack_16a8 = (fdb_doc *)0x11702e;
        fdb_doc_create((fdb_doc **)pfVar14,apfStack_1680[(long)pcVar21]->key,
                       apfStack_1680[(long)pcVar21]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_16a8 = (fdb_doc *)0x11703d;
        fVar5 = fdb_get(pfStack_1690,pfStack_1698);
        pfVar18 = pfStack_1698;
        if ((fdb_doc *)pcVar21 == (fdb_doc *)0x5) {
          if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001171bd;
        }
        else {
          if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001171b8;
          ppfVar25 = (fdb_doc **)pfStack_1698->meta;
          unaff_R13 = (code *)apfStack_1680[(long)pcVar21];
          unaff_R12 = (char *)((fdb_kvs_handle *)unaff_R13)->staletree;
          pfStack_16a8 = (fdb_doc *)0x11707c;
          iVar6 = bcmp(ppfVar25,unaff_R12,pfStack_1698->metalen);
          if (iVar6 != 0) goto LAB_001171c7;
          ppfVar25 = (fdb_doc **)pfVar18->body;
          unaff_R12 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
          pfStack_16a8 = (fdb_doc *)0x11709b;
          iVar6 = bcmp(ppfVar25,unaff_R12,pfVar18->bodylen);
          unaff_R13 = (code *)0x0;
          if (iVar6 != 0) goto LAB_001171d7;
        }
        unaff_R13 = (code *)0x0;
        pfStack_16a8 = (fdb_doc *)0x1170b1;
        fdb_doc_free(pfVar18);
        pfStack_1698 = (fdb_doc *)0x0;
        pfStack_16a8 = (fdb_doc *)0x1170d6;
        fdb_doc_create((fdb_doc **)pfVar14,apfStack_1680[(long)pcVar21]->key,
                       apfStack_1680[(long)pcVar21]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_16a8 = (fdb_doc *)0x1170e5;
        fVar5 = fdb_get_metaonly(pfStack_1690,pfStack_1698);
        if ((fdb_doc *)pcVar21 == (fdb_doc *)0x5) {
          if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001171c2;
        }
        else if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001171d2;
        pfStack_16a8 = (fdb_doc *)0x117107;
        fdb_doc_free(pfStack_1698);
        pfStack_1698 = (fdb_doc *)0x0;
        pcVar21 = (char *)((long)&((fdb_doc *)pcVar21)->keylen + 1);
        pfVar12 = pfVar18;
        if ((fdb_doc *)pcVar21 == (fdb_doc *)0xa) {
          pfStack_16a8 = (fdb_doc *)0x117127;
          fdb_kvs_close(pfStack_1690);
          pfStack_16a8 = (fdb_doc *)0x117131;
          fdb_close((fdb_file_handle *)pfStack_1688);
          lVar16 = 0;
          do {
            pfStack_16a8 = (fdb_doc *)0x11713d;
            fdb_doc_free(apfStack_1680[lVar16]);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 10);
          pfStack_16a8 = (fdb_doc *)0x11714b;
          fdb_shutdown();
          pfStack_16a8 = (fdb_doc *)0x117150;
          memleak_end();
          pcVar21 = "%s PASSED\n";
          if (purge_logically_deleted_doc_test()::__test_pass != '\0') {
            pcVar21 = "%s FAILED\n";
          }
          pfStack_16a8 = (fdb_doc *)0x117181;
          fprintf(_stderr,pcVar21,"purge logically deleted doc test");
          return;
        }
      } while( true );
    }
  }
  else {
LAB_001171e7:
    pfStack_16a8 = (fdb_doc *)0x1171ec;
    purge_logically_deleted_doc_test();
  }
  pfStack_16a8 = (fdb_doc *)api_wrapper_test;
  purge_logically_deleted_doc_test();
  pfStack_1b30 = (fdb_doc *)0x11720e;
  pfStack_16d0 = pfVar15;
  pfStack_16c8 = (fdb_kvs_handle *)unaff_R12;
  pfStack_16c0 = (fdb_kvs_handle *)unaff_R13;
  pfStack_16b8 = pfVar12;
  ppfStack_16b0 = ppfVar25;
  pfStack_16a8 = (fdb_doc *)pcVar21;
  gettimeofday((timeval *)(auStack_1b10 + 0x10),(__timezone_ptr_t)0x0);
  pfStack_1b30 = (fdb_doc *)0x117213;
  memleak_start();
  pfStack_1b30 = (fdb_doc *)0x11721f;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1b30 = (fdb_doc *)0x11722f;
  fdb_get_default_config();
  pfVar14 = (fdb_kvs_handle *)auStack_1af0;
  pfStack_1b30 = (fdb_doc *)0x11723c;
  fdb_get_default_kvs_config();
  afStack_18d0[0].buffercache_size = 0;
  afStack_18d0[0].wal_threshold = 0x400;
  afStack_18d0[0].flags = 1;
  afStack_18d0[0].purging_interval = 0;
  afStack_18d0[0].compaction_threshold = '\0';
  pcVar26 = auStack_1b10 + 8;
  pfStack_1b30 = (fdb_doc *)0x117275;
  fdb_open((fdb_file_handle **)pcVar26,"./dummy1",afStack_18d0);
  pfVar15 = (fdb_kvs_handle *)&pfStack_1b20;
  pfStack_1b30 = (fdb_doc *)0x117288;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1b10._8_8_,(fdb_kvs_handle **)pfVar15,
             (fdb_kvs_config *)pfVar14);
  pfStack_1b30 = (fdb_doc *)0x11729e;
  fVar5 = fdb_set_log_callback(pfStack_1b20,logCallbackFunc,"api_wrapper_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_1b30 = (fdb_doc *)0x1172b9;
    fVar5 = fdb_set_kv(pfStack_1b20,(void *)0x0,0,(void *)0x0,0);
    if (fVar5 != FDB_RESULT_INVALID_ARGS) goto LAB_0011750b;
    pcVar19 = auStack_1af0 + 0x18;
    pcVar26 = "body%d";
    unaff_R12 = (char *)(afStack_18d0 + 1);
    pcVar21 = (char *)0x0;
    do {
      pfStack_1b30 = (fdb_doc *)0x1172eb;
      sprintf(pcVar19,"key%d",pcVar21);
      pfStack_1b30 = (fdb_doc *)0x1172fa;
      sprintf(unaff_R12,"body%d",pcVar21);
      unaff_R13 = (code *)pfStack_1b20;
      pfStack_1b30 = (fdb_doc *)0x117307;
      pfVar15 = (fdb_kvs_handle *)strlen(pcVar19);
      pfStack_1b30 = (fdb_doc *)0x117312;
      sVar7 = strlen(unaff_R12);
      pfStack_1b30 = (fdb_doc *)0x117326;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,pcVar19,(size_t)pfVar15,unaff_R12,sVar7);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_1b30 = (fdb_doc *)0x1174ec;
        api_wrapper_test();
        goto LAB_001174ec;
      }
      uVar20 = (int)pcVar21 + 1;
      pcVar21 = (char *)(ulong)uVar20;
    } while (uVar20 != 10);
    pfVar15 = (fdb_kvs_handle *)(auStack_1af0 + 0x18);
    pfStack_1b30 = (fdb_doc *)0x117350;
    sprintf((char *)pfVar15,"key%d",5);
    pfVar14 = pfStack_1b20;
    pfStack_1b30 = (fdb_doc *)0x11735d;
    sVar7 = strlen((char *)pfVar15);
    pfStack_1b30 = (fdb_doc *)0x11736b;
    fVar5 = fdb_del_kv(pfVar14,pfVar15,sVar7);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00117510;
    pfStack_1b30 = (fdb_doc *)0x117381;
    fVar5 = fdb_del_kv(pfStack_1b20,(void *)0x0,0);
    if (fVar5 != FDB_RESULT_INVALID_ARGS) goto LAB_00117515;
    pfVar14 = (fdb_kvs_handle *)(auStack_1af0 + 0x18);
    pcVar26 = (char *)&pfStack_1b18;
    unaff_R12 = auStack_1b10;
    pcVar21 = (char *)afStack_19d8;
    unaff_R13 = (code *)0x0;
    do {
      pfStack_1b30 = (fdb_doc *)0x1173b8;
      sprintf((char *)pfVar14,"key%d",unaff_R13);
      pfVar15 = pfStack_1b20;
      pfStack_1b30 = (fdb_doc *)0x1173c5;
      sVar7 = strlen((char *)pfVar14);
      pfStack_1b30 = (fdb_doc *)0x1173d9;
      fVar5 = fdb_get_kv(pfVar15,pfVar14,sVar7,(void **)pcVar26,(size_t *)unaff_R12);
      if ((int)unaff_R13 == 5) {
        if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00117501;
      }
      else {
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001174fc;
        pfStack_1b30 = (fdb_doc *)0x117405;
        sprintf(pcVar21,"body%d",unaff_R13);
        pfVar15 = pfStack_1b18;
        pfStack_1b30 = (fdb_doc *)0x11741a;
        iVar6 = bcmp(pfStack_1b18,pcVar21,auStack_1b10._0_8_);
        if (iVar6 != 0) goto LAB_001174ec;
        pfStack_1b30 = (fdb_doc *)0x11742a;
        fdb_free_block(pfVar15);
      }
      uVar20 = (int)unaff_R13 + 1;
      unaff_R13 = (code *)(ulong)uVar20;
    } while (uVar20 != 10);
    pfStack_1b30 = (fdb_doc *)0x11744f;
    fVar5 = fdb_get_kv(pfStack_1b20,(void *)0x0,0,&pfStack_1b18,(size_t *)auStack_1b10);
    handle = pfStack_1b20;
    if (fVar5 != FDB_RESULT_INVALID_ARGS) goto LAB_0011751a;
    pfVar14 = (fdb_kvs_handle *)(auStack_1af0 + 0x18);
    pfStack_1b30 = (fdb_doc *)0x11746a;
    sVar7 = strlen((char *)pfVar14);
    pfStack_1b30 = (fdb_doc *)0x11747d;
    fVar5 = fdb_get_kv(handle,pfVar14,sVar7,(void **)0x0,(size_t *)0x0);
    if (fVar5 == FDB_RESULT_INVALID_ARGS) {
      pfStack_1b30 = (fdb_doc *)0x117490;
      fdb_kvs_close(pfStack_1b20);
      pfStack_1b30 = (fdb_doc *)0x11749a;
      fdb_close((fdb_file_handle *)auStack_1b10._8_8_);
      pfStack_1b30 = (fdb_doc *)0x11749f;
      fdb_shutdown();
      pfStack_1b30 = (fdb_doc *)0x1174a4;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (api_wrapper_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_1b30 = (fdb_doc *)0x1174d5;
      fprintf(_stderr,pcVar21,"API wrapper test");
      return;
    }
  }
  else {
LAB_00117506:
    pfStack_1b30 = (fdb_doc *)0x11750b;
    api_wrapper_test();
LAB_0011750b:
    pfStack_1b30 = (fdb_doc *)0x117510;
    api_wrapper_test();
LAB_00117510:
    pfStack_1b30 = (fdb_doc *)0x117515;
    api_wrapper_test();
LAB_00117515:
    pfStack_1b30 = (fdb_doc *)0x11751a;
    api_wrapper_test();
LAB_0011751a:
    handle = pfVar15;
    pfStack_1b30 = (fdb_doc *)0x11751f;
    api_wrapper_test();
  }
  pfStack_1b30 = (fdb_doc *)flush_before_commit_test;
  api_wrapper_test();
  pfStack_20b8 = (fdb_doc *)0x117544;
  pfStack_1b58 = handle;
  pfStack_1b50 = (fdb_kvs_handle *)unaff_R12;
  pfStack_1b48 = (fdb_kvs_handle *)unaff_R13;
  pfStack_1b40 = pfVar14;
  ppfStack_1b38 = (fdb_kvs_handle **)pcVar26;
  pfStack_1b30 = (fdb_doc *)pcVar21;
  gettimeofday(&tStack_1f88,(__timezone_ptr_t)0x0);
  pfStack_20b8 = (fdb_doc *)0x117549;
  memleak_start();
  pfStack_20b8 = (fdb_doc *)0x117555;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_20b8 = (fdb_doc *)0x117565;
  fdb_get_default_config();
  pfStack_20b8 = (fdb_doc *)0x117575;
  fdb_get_default_kvs_config();
  fStack_1e58.buffercache_size = 0;
  fStack_1e58.wal_threshold = 5;
  fStack_1e58.flags = 1;
  fStack_1e58.purging_interval = 0;
  fStack_1e58.compaction_threshold = '\0';
  fStack_1e58.wal_flush_before_commit = true;
  pfStack_20b8 = (fdb_doc *)0x1175b9;
  fdb_open(&pfStack_2088,"dummy1",&fStack_1e58);
  pfStack_20b8 = (fdb_doc *)0x1175cc;
  fdb_open(&pfStack_20a0,"dummy1",&fStack_1e58);
  pfStack_20b8 = (fdb_doc *)0x1175dd;
  fdb_kvs_open_default(pfStack_2088,&pfStack_2090,&fStack_1f78);
  pfStack_20b8 = (fdb_doc *)0x1175f1;
  fdb_kvs_open_default(pfStack_20a0,&pfStack_2098,&fStack_1f78);
  pfStack_20b8 = (fdb_doc *)0x117607;
  fVar5 = fdb_set_log_callback(pfStack_2098,logCallbackFunc,"flush_before_commit_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    ppfVar25 = apfStack_2080;
    uVar23 = 0;
    do {
      pfStack_20b8 = (fdb_doc *)0x117633;
      sprintf(acStack_1f60,"key%d",uVar23 & 0xffffffff);
      pfStack_20b8 = (fdb_doc *)0x11764f;
      sprintf(acStack_1c60,"meta%d",uVar23 & 0xffffffff);
      pfStack_20b8 = (fdb_doc *)0x11766b;
      sprintf(acStack_1d60,"body%d",uVar23 & 0xffffffff);
      pfStack_20b8 = (fdb_doc *)0x117673;
      sVar7 = strlen(acStack_1f60);
      pfStack_20b8 = (fdb_doc *)0x11767e;
      sVar8 = strlen(acStack_1c60);
      pfStack_20b8 = (fdb_doc *)0x117689;
      sVar11 = strlen(acStack_1d60);
      pfStack_20b8 = (fdb_doc *)0x1176a9;
      fdb_doc_create(ppfVar25,acStack_1f60,sVar7,acStack_1c60,sVar8,acStack_1d60,sVar11);
      uVar23 = uVar23 + 1;
      ppfVar25 = ppfVar25 + 1;
    } while (uVar23 != 0x1e);
    pfStack_20b8 = (fdb_doc *)0x1176c9;
    fdb_begin_transaction(pfStack_20a0,'\x02');
    pfStack_20b8 = (fdb_doc *)0x1176d8;
    fdb_set(pfStack_2090,apfStack_2080[0]);
    pfStack_20b8 = (fdb_doc *)0x1176e7;
    fdb_set(pfStack_2090,apfStack_2080[1]);
    lVar16 = 0;
    pfStack_20b8 = (fdb_doc *)0x1176f5;
    fdb_commit(pfStack_2088,'\0');
    pfStack_20b8 = (fdb_doc *)0x117704;
    fdb_set(pfStack_2098,apfStack_2080[0]);
    pfStack_20b8 = (fdb_doc *)0x117713;
    fdb_set(pfStack_2098,apfStack_2080[1]);
    pfStack_20b8 = (fdb_doc *)0x11771f;
    fdb_end_transaction(pfStack_20a0,'\0');
    pfStack_20b8 = (fdb_doc *)0x11772e;
    fdb_commit(pfStack_2088,'\x01');
    pfStack_20b8 = (fdb_doc *)0x11773d;
    fdb_begin_transaction(pfStack_20a0,'\x02');
    pfStack_20b8 = (fdb_doc *)0x11774c;
    fdb_set(pfStack_2098,apfStack_2080[0]);
    pfStack_20b8 = (fdb_doc *)0x11775b;
    fdb_set(pfStack_2098,apfStack_2080[1]);
    pfStack_20b8 = (fdb_doc *)0x117767;
    fdb_end_transaction(pfStack_20a0,'\0');
    pfStack_20b8 = (fdb_doc *)0x117776;
    fdb_set(pfStack_2090,apfStack_2080[0]);
    pfStack_20b8 = (fdb_doc *)0x117785;
    fdb_set(pfStack_2090,apfStack_2080[1]);
    pfStack_20b8 = (fdb_doc *)0x117791;
    fdb_commit(pfStack_2088,'\0');
    pfStack_20b8 = (fdb_doc *)0x1177a0;
    fdb_commit(pfStack_2088,'\x01');
    pfStack_20b8 = (fdb_doc *)0x1177af;
    fdb_begin_transaction(pfStack_20a0,'\x02');
    pfStack_20b8 = (fdb_doc *)0x1177be;
    fdb_set(pfStack_2098,apfStack_2080[0]);
    pfStack_20b8 = (fdb_doc *)0x1177cd;
    fdb_set(pfStack_2098,apfStack_2080[1]);
    pfStack_20b8 = (fdb_doc *)0x1177dc;
    fdb_set(pfStack_2090,apfStack_2080[0]);
    pfStack_20b8 = (fdb_doc *)0x1177eb;
    fdb_set(pfStack_2090,apfStack_2080[1]);
    pfStack_20b8 = (fdb_doc *)0x1177f7;
    fdb_commit(pfStack_2088,'\0');
    pfStack_20b8 = (fdb_doc *)0x117803;
    fdb_end_transaction(pfStack_20a0,'\0');
    pfStack_20b8 = (fdb_doc *)0x117812;
    fdb_commit(pfStack_2088,'\x01');
    pfStack_20b8 = (fdb_doc *)0x117821;
    fdb_begin_transaction(pfStack_20a0,'\x02');
    pfStack_20b8 = (fdb_doc *)0x117830;
    fdb_set(pfStack_2090,apfStack_2080[0]);
    pfStack_20b8 = (fdb_doc *)0x11783f;
    fdb_set(pfStack_2090,apfStack_2080[1]);
    pfStack_20b8 = (fdb_doc *)0x11784e;
    fdb_set(pfStack_2098,apfStack_2080[0]);
    pfStack_20b8 = (fdb_doc *)0x11785d;
    fdb_set(pfStack_2098,apfStack_2080[1]);
    pfStack_20b8 = (fdb_doc *)0x117869;
    fdb_end_transaction(pfStack_20a0,'\0');
    pfStack_20b8 = (fdb_doc *)0x117875;
    fdb_commit(pfStack_2088,'\0');
    pfStack_20b8 = (fdb_doc *)0x117884;
    fdb_commit(pfStack_2088,'\x01');
    pfStack_20b8 = (fdb_doc *)0x117893;
    fdb_begin_transaction(pfStack_20a0,'\x02');
    do {
      pfStack_20b8 = (fdb_doc *)0x1178a2;
      fdb_set(pfStack_2098,apfStack_2080[lVar16]);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 10);
    lVar16 = 0;
    do {
      pfStack_20b8 = (fdb_doc *)0x1178bf;
      fdb_set(pfStack_2090,apfStack_2080[lVar16 + 10]);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 10);
    pfStack_20b8 = (fdb_doc *)0x1178d9;
    fdb_compact(pfStack_2088,"dummy2");
    lVar16 = 0;
    do {
      pfStack_20b8 = (fdb_doc *)0x1178ed;
      fdb_set(pfStack_2098,apfStack_2080[lVar16 + 0x14]);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 5);
    lVar16 = 0;
    pfStack_20b8 = (fdb_doc *)0x117904;
    fdb_end_transaction(pfStack_20a0,'\0');
    do {
      pfStack_20b8 = (fdb_doc *)0x117916;
      fdb_set(pfStack_2090,apfStack_2080[lVar16 + 0x19]);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 5);
    pfStack_20b8 = (fdb_doc *)0x117929;
    fdb_close(pfStack_2088);
    pfStack_20b8 = (fdb_doc *)0x117933;
    fdb_close(pfStack_20a0);
    lVar16 = 0;
    do {
      pfStack_20b8 = (fdb_doc *)0x11793f;
      fdb_doc_free(apfStack_2080[lVar16]);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x1e);
    pfStack_20b8 = (fdb_doc *)0x11794d;
    fdb_shutdown();
    pfStack_20b8 = (fdb_doc *)0x117952;
    memleak_end();
    pcVar21 = "%s PASSED\n";
    if (flush_before_commit_test()::__test_pass != '\0') {
      pcVar21 = "%s FAILED\n";
    }
    pfStack_20b8 = (fdb_doc *)0x117983;
    fprintf(_stderr,pcVar21,"flush before commit test");
    return;
  }
  pfStack_20b8 = (fdb_doc *)flush_before_commit_multi_writers_test;
  flush_before_commit_test();
  pcStack_20c0 = "dummy1";
  pfStack_2590 = (fdb_encryption_key *)0x1179bd;
  pfStack_20e0 = &fStack_1f78;
  ppfStack_20d8 = &pfStack_2088;
  ppfStack_20d0 = &pfStack_20a0;
  ppfStack_20c8 = &pfStack_2098;
  pfStack_20b8 = (fdb_doc *)pcVar21;
  gettimeofday(&tStack_24e8,(__timezone_ptr_t)0x0);
  pfStack_2590 = (fdb_encryption_key *)0x1179c2;
  memleak_start();
  pfStack_2580 = (fdb_doc *)0x0;
  pfStack_2590 = (fdb_encryption_key *)0x1179d3;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_2590 = (fdb_encryption_key *)0x1179e3;
  fdb_get_default_config();
  fStack_21d8.buffercache_size = 0;
  fStack_21d8.wal_threshold = 8;
  fStack_21d8.flags = 1;
  fStack_21d8.purging_interval = 0;
  fStack_21d8.compaction_threshold = '\0';
  fStack_21d8.wal_flush_before_commit = true;
  pfStack_2590 = (fdb_encryption_key *)0x117a15;
  fdb_get_default_kvs_config();
  pfStack_2590 = (fdb_encryption_key *)0x117a2c;
  fdb_open(&pfStack_2568,"dummy1",&fStack_21d8);
  pfStack_2590 = (fdb_encryption_key *)0x117a3e;
  fdb_kvs_open(pfStack_2568,&pfStack_2578,(char *)0x0,&fStack_2500);
  lVar16 = 0;
  uVar23 = 0;
  do {
    ppfVar13 = &fStack_24d8.bub_ctx.handle;
    pfStack_2590 = (fdb_encryption_key *)0x117a5e;
    sprintf((char *)ppfVar13,"key%d",uVar23 & 0xffffffff);
    pfStack_2590 = (fdb_encryption_key *)0x117a76;
    sprintf((char *)&fStack_24d8.config.encryption_key,"meta%d",uVar23 & 0xffffffff);
    pfStack_2590 = (fdb_encryption_key *)0x117a8e;
    sprintf((char *)&fStack_24d8,"body%d",uVar23 & 0xffffffff);
    pfStack_2590 = (fdb_encryption_key *)0x117a9e;
    sVar7 = strlen((char *)ppfVar13);
    pfVar22 = &fStack_24d8.config.encryption_key;
    pfStack_2590 = (fdb_encryption_key *)0x117ab1;
    sVar8 = strlen((char *)pfVar22);
    pfStack_2590 = (fdb_encryption_key *)0x117ac1;
    sVar11 = strlen((char *)&fStack_24d8);
    pfStack_2590 = (fdb_encryption_key *)0x117ae6;
    fdb_doc_create((fdb_doc **)((long)apfStack_2558 + lVar16),&fStack_24d8.bub_ctx.handle,sVar7,
                   pfVar22,sVar8,&fStack_24d8,sVar11);
    pfStack_2590 = (fdb_encryption_key *)0x117af5;
    fdb_set(pfStack_2578,apfStack_2558[uVar23]);
    uVar23 = uVar23 + 1;
    lVar16 = lVar16 + 8;
  } while (uVar23 != 10);
  pfStack_2590 = (fdb_encryption_key *)0x117b15;
  fdb_commit(pfStack_2568,'\x01');
  pfStack_2590 = (fdb_encryption_key *)0x117b31;
  fdb_open(&pfStack_2560,"dummy1",&fStack_21d8);
  pfStack_2590 = (fdb_encryption_key *)0x117b48;
  fdb_kvs_open(pfStack_2560,&pfStack_2570,(char *)0x0,&fStack_2500);
  pfVar22 = &fStack_24d8.config.encryption_key;
  lVar16 = 0;
  uVar23 = 0;
  do {
    pfStack_2590 = (fdb_encryption_key *)0x117b71;
    sprintf((char *)pfVar22,"meta2%d",uVar23 & 0xffffffff);
    pfStack_2590 = (fdb_encryption_key *)0x117b85;
    sprintf((char *)&fStack_24d8,"body2%d(db2)",uVar23 & 0xffffffff);
    pfStack_2590 = (fdb_encryption_key *)0x117b95;
    sVar7 = strlen((char *)pfVar22);
    pfStack_2590 = (fdb_encryption_key *)0x117ba0;
    sVar8 = strlen((char *)&fStack_24d8);
    pfStack_2590 = (fdb_encryption_key *)0x117bb4;
    fdb_doc_update((fdb_doc **)((long)apfStack_2558 + lVar16),pfVar22,sVar7,&fStack_24d8,sVar8);
    pfStack_2590 = (fdb_encryption_key *)0x117bc3;
    fdb_set(pfStack_2570,apfStack_2558[uVar23]);
    uVar23 = uVar23 + 1;
    lVar16 = lVar16 + 8;
  } while (uVar23 != 5);
  uVar23 = 5;
  lVar16 = 0x28;
  pfVar22 = &fStack_24d8.config.encryption_key;
  pfVar15 = &fStack_24d8;
  do {
    pfStack_2590 = (fdb_encryption_key *)0x117c05;
    sprintf((char *)pfVar22,"meta2%d",uVar23 & 0xffffffff);
    pfStack_2590 = (fdb_encryption_key *)0x117c14;
    sprintf((char *)pfVar15,"body2%d(db1)",uVar23 & 0xffffffff);
    pfStack_2590 = (fdb_encryption_key *)0x117c24;
    sVar7 = strlen((char *)pfVar22);
    pfStack_2590 = (fdb_encryption_key *)0x117c2f;
    sVar8 = strlen((char *)pfVar15);
    pfStack_2590 = (fdb_encryption_key *)0x117c4a;
    fdb_doc_update((fdb_doc **)((long)apfStack_2558 + lVar16),pfVar22,sVar7,pfVar15,sVar8);
    pfStack_2590 = (fdb_encryption_key *)0x117c59;
    fdb_set(pfStack_2578,apfStack_2558[uVar23]);
    uVar23 = uVar23 + 1;
    lVar16 = lVar16 + 8;
  } while (uVar23 != 10);
  ppfVar13 = &fStack_24d8.bub_ctx.handle;
  pfVar22 = &fStack_24d8.config.encryption_key;
  uVar23 = 0;
  do {
    pcVar21 = "body2%d(db1)";
    pfStack_2590 = (fdb_encryption_key *)0x117c93;
    sprintf((char *)ppfVar13,"key%d",uVar23);
    pfStack_2590 = (fdb_encryption_key *)0x117ca6;
    sprintf((char *)pfVar22,"meta2%d",uVar23);
    if ((uint)uVar23 < 5) {
      pcVar21 = "body2%d(db2)";
    }
    pfStack_2590 = (fdb_encryption_key *)0x117cc3;
    sprintf((char *)&fStack_24d8,pcVar21,uVar23);
    pfStack_2590 = (fdb_encryption_key *)0x117ccb;
    sVar7 = strlen((char *)ppfVar13);
    pfStack_2590 = (fdb_encryption_key *)0x117ceb;
    fdb_doc_create(&pfStack_2580,ppfVar13,sVar7,(void *)0x0,0,(void *)0x0,0);
    pfStack_2590 = (fdb_encryption_key *)0x117cfa;
    fVar5 = fdb_get(pfStack_2578,pfStack_2580);
    pfVar12 = pfStack_2580;
    if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_00118008:
      pfStack_2590 = (fdb_encryption_key *)0x11800d;
      flush_before_commit_multi_writers_test();
LAB_0011800d:
      pfStack_2590 = (fdb_encryption_key *)0x118012;
      flush_before_commit_multi_writers_test();
      pfVar12 = (fdb_doc *)pcVar21;
LAB_00118012:
      pfStack_2590 = (fdb_encryption_key *)0x118022;
      flush_before_commit_multi_writers_test();
LAB_00118022:
      pfStack_2590 = (fdb_encryption_key *)0x118032;
      flush_before_commit_multi_writers_test();
LAB_00118032:
      pfStack_2590 = (fdb_encryption_key *)0x118042;
      flush_before_commit_multi_writers_test();
      goto LAB_00118042;
    }
    pfVar15 = (fdb_kvs_handle *)pfStack_2580->meta;
    pfStack_2590 = (fdb_encryption_key *)0x117d1a;
    iVar6 = bcmp(pfVar22,pfVar15,pfStack_2580->metalen);
    if (iVar6 != 0) {
      pfStack_2590 = (fdb_encryption_key *)0x118008;
      flush_before_commit_multi_writers_test();
      pcVar21 = (char *)pfVar12;
      goto LAB_00118008;
    }
    pfVar15 = (fdb_kvs_handle *)pfVar12->body;
    pfStack_2590 = (fdb_encryption_key *)0x117d35;
    iVar6 = bcmp(&fStack_24d8,pfVar15,pfVar12->bodylen);
    if (iVar6 != 0) goto LAB_00118012;
    pfStack_2590 = (fdb_encryption_key *)0x117d45;
    fdb_doc_free(pfVar12);
    pcVar21 = (char *)0x0;
    pfStack_2580 = (fdb_doc *)0x0;
    pfStack_2590 = (fdb_encryption_key *)0x117d55;
    sVar7 = strlen((char *)ppfVar13);
    pfStack_2590 = (fdb_encryption_key *)0x117d71;
    fdb_doc_create(&pfStack_2580,ppfVar13,sVar7,(void *)0x0,0,(void *)0x0,0);
    pfStack_2590 = (fdb_encryption_key *)0x117d80;
    fVar5 = fdb_get(pfStack_2570,pfStack_2580);
    pfVar12 = pfStack_2580;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011800d;
    pfVar15 = (fdb_kvs_handle *)pfStack_2580->meta;
    pfStack_2590 = (fdb_encryption_key *)0x117da0;
    iVar6 = bcmp(pfVar22,pfVar15,pfStack_2580->metalen);
    if (iVar6 != 0) goto LAB_00118032;
    pfVar15 = (fdb_kvs_handle *)pfVar12->body;
    pfStack_2590 = (fdb_encryption_key *)0x117dbb;
    iVar6 = bcmp(&fStack_24d8,pfVar15,pfVar12->bodylen);
    if (iVar6 != 0) goto LAB_00118022;
    pfStack_2590 = (fdb_encryption_key *)0x117dcb;
    fdb_doc_free(pfVar12);
    pfStack_2580 = (fdb_doc *)0x0;
    uVar20 = (uint)uVar23 + 1;
    uVar23 = (ulong)uVar20;
  } while (uVar20 != 10);
  pfStack_2590 = (fdb_encryption_key *)0x117df2;
  fdb_commit(pfStack_2568,'\0');
  pfStack_2590 = (fdb_encryption_key *)0x117dfe;
  fdb_commit(pfStack_2560,'\0');
  ppfVar13 = &fStack_24d8.bub_ctx.handle;
  pfVar22 = &fStack_24d8.config.encryption_key;
  uVar23 = 0;
  while( true ) {
    pfStack_2590 = (fdb_encryption_key *)0x117e32;
    sprintf((char *)ppfVar13,"key%d",uVar23);
    pfStack_2590 = (fdb_encryption_key *)0x117e45;
    sprintf((char *)pfVar22,"meta2%d",uVar23);
    pcVar21 = "body2%d(db1)";
    if ((uint)uVar23 < 5) {
      pcVar21 = "body2%d(db2)";
    }
    pfStack_2590 = (fdb_encryption_key *)0x117e5f;
    sprintf((char *)&fStack_24d8,pcVar21,uVar23);
    pfStack_2590 = (fdb_encryption_key *)0x117e67;
    sVar7 = strlen((char *)ppfVar13);
    pfStack_2590 = (fdb_encryption_key *)0x117e87;
    fdb_doc_create(&pfStack_2580,ppfVar13,sVar7,(void *)0x0,0,(void *)0x0,0);
    pfStack_2590 = (fdb_encryption_key *)0x117e96;
    fVar5 = fdb_get(pfStack_2578,pfStack_2580);
    pfVar12 = pfStack_2580;
    pfVar18 = (fdb_doc *)"body2%d(db2)";
    if (fVar5 != FDB_RESULT_SUCCESS) break;
    pfVar15 = (fdb_kvs_handle *)pfStack_2580->meta;
    pfStack_2590 = (fdb_encryption_key *)0x117eb6;
    iVar6 = bcmp(pfVar22,pfVar15,pfStack_2580->metalen);
    if (iVar6 != 0) goto LAB_00118042;
    pfVar15 = (fdb_kvs_handle *)pfVar12->body;
    pfStack_2590 = (fdb_encryption_key *)0x117ed1;
    iVar6 = bcmp(&fStack_24d8,pfVar15,pfVar12->bodylen);
    if (iVar6 != 0) goto LAB_0011805c;
    pfStack_2590 = (fdb_encryption_key *)0x117ee1;
    fdb_doc_free(pfVar12);
    pfVar18 = (fdb_doc *)0x0;
    pfStack_2580 = (fdb_doc *)0x0;
    pfStack_2590 = (fdb_encryption_key *)0x117ef1;
    sVar7 = strlen((char *)ppfVar13);
    pfStack_2590 = (fdb_encryption_key *)0x117f0d;
    fdb_doc_create(&pfStack_2580,ppfVar13,sVar7,(void *)0x0,0,(void *)0x0,0);
    pfStack_2590 = (fdb_encryption_key *)0x117f1c;
    fVar5 = fdb_get(pfStack_2570,pfStack_2580);
    pfVar12 = pfStack_2580;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00118057;
    pfVar15 = (fdb_kvs_handle *)pfStack_2580->meta;
    pfStack_2590 = (fdb_encryption_key *)0x117f3c;
    iVar6 = bcmp(pfVar22,pfVar15,pfStack_2580->metalen);
    if (iVar6 != 0) goto LAB_0011807c;
    pfVar15 = (fdb_kvs_handle *)pfVar12->body;
    pfStack_2590 = (fdb_encryption_key *)0x117f57;
    iVar6 = bcmp(&fStack_24d8,pfVar15,pfVar12->bodylen);
    if (iVar6 != 0) goto LAB_0011806c;
    pfStack_2590 = (fdb_encryption_key *)0x117f67;
    fdb_doc_free(pfVar12);
    pfStack_2580 = (fdb_doc *)0x0;
    uVar20 = (uint)uVar23 + 1;
    uVar23 = (ulong)uVar20;
    if (uVar20 == 10) {
      pfStack_2590 = (fdb_encryption_key *)0x117f8c;
      fdb_close(pfStack_2568);
      pfStack_2590 = (fdb_encryption_key *)0x117f96;
      fdb_close(pfStack_2560);
      lVar16 = 0;
      do {
        pfStack_2590 = (fdb_encryption_key *)0x117fa2;
        fdb_doc_free(apfStack_2558[lVar16]);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 10);
      pfStack_2590 = (fdb_encryption_key *)0x117fb0;
      fdb_shutdown();
      pfStack_2590 = (fdb_encryption_key *)0x117fb5;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (flush_before_commit_multi_writers_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_2590 = (fdb_encryption_key *)0x117fe6;
      fprintf(_stderr,pcVar21,"flush before commit with multi writers test");
      return;
    }
  }
LAB_00118052:
  pfStack_2590 = (fdb_encryption_key *)0x118057;
  flush_before_commit_multi_writers_test();
LAB_00118057:
  pfStack_2590 = (fdb_encryption_key *)0x11805c;
  flush_before_commit_multi_writers_test();
  pfVar12 = pfVar18;
LAB_0011805c:
  pfStack_2590 = (fdb_encryption_key *)0x11806c;
  flush_before_commit_multi_writers_test();
LAB_0011806c:
  pfStack_2590 = (fdb_encryption_key *)0x11807c;
  flush_before_commit_multi_writers_test();
LAB_0011807c:
  pfVar14 = &fStack_24d8;
  ppfVar13 = &fStack_24d8.bub_ctx.handle;
  pfVar22 = &fStack_24d8.config.encryption_key;
  pfStack_2590 = (fdb_encryption_key *)auto_commit_test;
  flush_before_commit_multi_writers_test();
  pfStack_2908 = (fdb_encryption_key *)0x1180a9;
  uStack_25b8 = uVar23;
  ppfStack_25b0 = ppfVar13;
  pfStack_25a8 = pfVar15;
  pfStack_25a0 = pfVar12;
  pfStack_2598 = pfVar14;
  pfStack_2590 = pfVar22;
  gettimeofday((timeval *)(auStack_28e0 + 0x20),(__timezone_ptr_t)0x0);
  pfStack_2908 = (fdb_encryption_key *)0x1180ae;
  memleak_start();
  pfStack_2908 = (fdb_encryption_key *)0x1180ba;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar17 = &fStack_26b0;
  pfStack_2908 = (fdb_encryption_key *)0x1180ca;
  fdb_get_default_config();
  pfStack_2908 = (fdb_encryption_key *)0x1180d4;
  fdb_get_default_kvs_config();
  fStack_26b0.buffercache_size = 0;
  fStack_26b0.wal_threshold = 0x1000;
  fStack_26b0.flags = 1;
  fStack_26b0.durability_opt = '\x02';
  fStack_26b0.auto_commit = true;
  pfStack_2908 = (fdb_encryption_key *)0x118107;
  fVar5 = fdb_open(&pfStack_28f0,"dummy1",pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_2908 = (fdb_encryption_key *)0x118123;
    fVar5 = fdb_kvs_open_default(pfStack_28f0,&pfStack_28f8,(fdb_kvs_config *)(auStack_28e0 + 8));
    pcVar21 = (char *)pfVar14;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001183c1;
    pcVar21 = "body%d";
    pfVar22 = (fdb_encryption_key *)0x0;
    do {
      pfStack_2908 = (fdb_encryption_key *)0x118154;
      sprintf((char *)afStack_27b0,"key%d",pfVar22);
      pfStack_2908 = (fdb_encryption_key *)0x118163;
      sprintf((char *)apfStack_28b0,"body%d",pfVar22);
      pfVar15 = pfStack_28f8;
      pfStack_2908 = (fdb_encryption_key *)0x118170;
      sVar7 = strlen((char *)afStack_27b0);
      pfVar17 = (fdb_config *)(sVar7 + 1);
      pfStack_2908 = (fdb_encryption_key *)0x11817c;
      sVar7 = strlen((char *)apfStack_28b0);
      pfStack_2908 = (fdb_encryption_key *)0x118191;
      fVar5 = fdb_set_kv(pfVar15,afStack_27b0,(size_t)pfVar17,apfStack_28b0,sVar7 + 1);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_2908 = (fdb_encryption_key *)0x118398;
        auto_commit_test();
        goto LAB_00118398;
      }
      uVar20 = (int)pfVar22 + 1;
      pfVar22 = (fdb_encryption_key *)(ulong)uVar20;
    } while (uVar20 != 5000);
    pfVar12 = afStack_27b0;
    ppfVar13 = apfStack_28b0;
    pfVar15 = (fdb_kvs_handle *)auStack_28e0;
    pfVar22 = (fdb_encryption_key *)auStack_28e8;
    pfVar17 = (fdb_config *)0x0;
    do {
      pfStack_2908 = (fdb_encryption_key *)0x1181cf;
      sprintf((char *)pfVar12,"key%d",pfVar17);
      pfStack_2908 = (fdb_encryption_key *)0x1181e2;
      sprintf((char *)ppfVar13,"body%d",pfVar17);
      pfVar14 = pfStack_28f8;
      pfStack_2908 = (fdb_encryption_key *)0x1181ef;
      sVar7 = strlen((char *)pfVar12);
      pfStack_2908 = (fdb_encryption_key *)0x118204;
      fVar5 = fdb_get_kv(pfVar14,pfVar12,sVar7 + 1,(void **)pfVar15,(size_t *)pfVar22);
      pcVar21 = (char *)auStack_28e0._0_8_;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001183a5;
      pfStack_2908 = (fdb_encryption_key *)0x118221;
      iVar6 = bcmp((void *)auStack_28e0._0_8_,ppfVar13,(size_t)auStack_28e8);
      if (iVar6 != 0) goto LAB_00118398;
      pfStack_2908 = (fdb_encryption_key *)0x118231;
      fdb_free_block(pcVar21);
      uVar20 = (int)pfVar17 + 1;
      pfVar17 = (fdb_config *)(ulong)uVar20;
    } while (uVar20 != 5000);
    pfStack_2908 = (fdb_encryption_key *)0x118245;
    fVar5 = fdb_kvs_close(pfStack_28f8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001183c6;
    pfStack_2908 = (fdb_encryption_key *)0x118257;
    fVar5 = fdb_close(pfStack_28f0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001183cb;
    pfStack_2908 = (fdb_encryption_key *)0x118278;
    fVar5 = fdb_open(&pfStack_28f0,"dummy1",&fStack_26b0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001183d0;
    pfStack_2908 = (fdb_encryption_key *)0x118294;
    fVar5 = fdb_kvs_open_default(pfStack_28f0,&pfStack_28f8,(fdb_kvs_config *)(auStack_28e0 + 8));
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001183d5;
    pfVar12 = afStack_27b0;
    ppfVar13 = apfStack_28b0;
    pfVar15 = (fdb_kvs_handle *)auStack_28e0;
    pfVar22 = (fdb_encryption_key *)auStack_28e8;
    pfVar17 = (fdb_config *)0x0;
    do {
      pfStack_2908 = (fdb_encryption_key *)0x1182c8;
      sprintf((char *)pfVar12,"key%d",pfVar17);
      pfStack_2908 = (fdb_encryption_key *)0x1182db;
      sprintf((char *)ppfVar13,"body%d",pfVar17);
      pfVar14 = pfStack_28f8;
      pfStack_2908 = (fdb_encryption_key *)0x1182e8;
      sVar7 = strlen((char *)pfVar12);
      pfStack_2908 = (fdb_encryption_key *)0x1182fd;
      fVar5 = fdb_get_kv(pfVar14,pfVar12,sVar7 + 1,(void **)pfVar15,(size_t *)pfVar22);
      pcVar21 = (char *)auStack_28e0._0_8_;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001183b7;
      pfStack_2908 = (fdb_encryption_key *)0x11831a;
      iVar6 = bcmp((void *)auStack_28e0._0_8_,ppfVar13,(size_t)auStack_28e8);
      if (iVar6 != 0) goto LAB_001183aa;
      pfStack_2908 = (fdb_encryption_key *)0x11832a;
      fdb_free_block(pcVar21);
      uVar20 = (int)pfVar17 + 1;
      pfVar17 = (fdb_config *)(ulong)uVar20;
    } while (uVar20 != 5000);
    pfStack_2908 = (fdb_encryption_key *)0x11833e;
    fVar5 = fdb_close(pfStack_28f0);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_2908 = (fdb_encryption_key *)0x11834b;
      fdb_shutdown();
      pfStack_2908 = (fdb_encryption_key *)0x118350;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (auto_commit_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_2908 = (fdb_encryption_key *)0x118381;
      fprintf(_stderr,pcVar21,"auto commit test");
      return;
    }
  }
  else {
LAB_001183bc:
    pfStack_2908 = (fdb_encryption_key *)0x1183c1;
    auto_commit_test();
    pcVar21 = (char *)pfVar14;
LAB_001183c1:
    pfStack_2908 = (fdb_encryption_key *)0x1183c6;
    auto_commit_test();
LAB_001183c6:
    pfStack_2908 = (fdb_encryption_key *)0x1183cb;
    auto_commit_test();
LAB_001183cb:
    pfStack_2908 = (fdb_encryption_key *)0x1183d0;
    auto_commit_test();
LAB_001183d0:
    pfStack_2908 = (fdb_encryption_key *)0x1183d5;
    auto_commit_test();
LAB_001183d5:
    pfStack_2908 = (fdb_encryption_key *)0x1183da;
    auto_commit_test();
  }
  pfStack_2908 = (fdb_encryption_key *)auto_commit_space_used_test;
  auto_commit_test();
  pcStack_2b80 = (code *)0x1183fc;
  pfStack_2930 = pfVar17;
  ppfStack_2928 = ppfVar13;
  pfStack_2920 = pfVar15;
  pfStack_2918 = pfVar12;
  pfStack_2910 = (fdb_kvs_handle *)pcVar21;
  pfStack_2908 = pfVar22;
  gettimeofday(&tStack_2b30,(__timezone_ptr_t)0x0);
  pcStack_2b80 = (code *)0x118401;
  memleak_start();
  pcStack_2b80 = (code *)0x11840d;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_2b80 = (code *)0x11841d;
  fdb_get_default_config();
  fStack_2a28.buffercache_size = 0;
  fStack_2a28.auto_commit = true;
  pcStack_2b80 = (code *)0x118436;
  fdb_get_default_config();
  pcStack_2b80 = (code *)0x118446;
  memcpy(&fStack_2a28,afStack_2b20,0xf8);
  pcStack_2b80 = (code *)0x118450;
  fdb_get_default_kvs_config();
  uVar23 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(acStack_2b68 + 8,"est1",5);
    builtin_strncpy(acStack_2b68,"./func_t",8);
    pcStack_2b80 = (code *)0x11849b;
    fVar5 = fdb_open(&pfStack_2b78,acStack_2b68,&fStack_2a28);
    if (fVar5 != FDB_RESULT_SUCCESS) break;
    pcStack_2b80 = (code *)0x1184b7;
    fVar5 = fdb_kvs_open(pfStack_2b78,&pfStack_2b70,"justonekv",&fStack_2b48);
    if (fVar5 != FDB_RESULT_SUCCESS) {
      pcStack_2b80 = (code *)0x118570;
      auto_commit_space_used_test();
      break;
    }
    pcStack_2b80 = (code *)0x1184cd;
    fVar5 = fdb_get_file_info(pfStack_2b78,afStack_2b20);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011857a;
    if (afStack_2b20[0].file_size != fStack_2a28.blocksize * 7) {
      pcStack_2b80 = (code *)0x11851c;
      auto_commit_space_used_test();
    }
    pcStack_2b80 = (code *)0x1184f8;
    fVar5 = fdb_close(pfStack_2b78);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00118575;
    uVar20 = (int)uVar23 + 1;
    uVar23 = (ulong)uVar20;
    if (uVar20 == 0) {
      pcStack_2b80 = (code *)0x118523;
      fdb_shutdown();
      pcStack_2b80 = (code *)0x118528;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pcStack_2b80 = (code *)0x118559;
      fprintf(_stderr,pcVar21,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_2b80 = (code *)0x118575;
  auto_commit_space_used_test();
LAB_00118575:
  pcStack_2b80 = (code *)0x11857a;
  auto_commit_space_used_test();
LAB_0011857a:
  pcStack_2b80 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_2b88 = 0x745f636e75662f2e;
  pcStack_2b98 = "justonekv";
  ppfStack_3118 = (fdb_kvs_handle **)0x1185a2;
  ppfStack_2ba8 = &pfStack_2b70;
  pcStack_2ba0 = acStack_2b68;
  uStack_2b90 = uVar23;
  pcStack_2b80 = (code *)&pfStack_2b78;
  gettimeofday(&tStack_2fb8,(__timezone_ptr_t)0x0);
  ppfStack_3118 = (fdb_kvs_handle **)0x1185a7;
  memleak_start();
  pfStack_3100 = (fdb_doc *)0x0;
  ppfStack_3118 = (fdb_kvs_handle **)0x1185b8;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_3118 = (fdb_kvs_handle **)0x1185c8;
  fdb_get_default_config();
  ppfStack_3118 = (fdb_kvs_handle **)0x1185d5;
  fdb_get_default_kvs_config();
  fStack_2fa8.buffercache_size = 0;
  fStack_2fa8.flags = 1;
  fStack_2fa8.purging_interval = 0;
  fStack_2fa8.compaction_threshold = '\0';
  ppfStack_3118 = (fdb_kvs_handle **)0x118608;
  fdb_open((fdb_file_handle **)(auStack_30f0 + 0x10),"dummy1",&fStack_2fa8);
  ppfStack_3118 = (fdb_kvs_handle **)0x11861b;
  fdb_open((fdb_file_handle **)auStack_30f0,"dummy1",&fStack_2fa8);
  ppfStack_3118 = (fdb_kvs_handle **)0x11862c;
  fdb_kvs_open_default((fdb_file_handle *)auStack_30f0._16_8_,&pfStack_30f8,&fStack_30c8);
  ppfStack_3118 = (fdb_kvs_handle **)0x11863d;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_30f0._0_8_,(fdb_kvs_handle **)(auStack_30f0 + 8),
             &fStack_30c8);
  ppfVar25 = apfStack_30b0;
  uVar23 = 0;
  do {
    ppfStack_3118 = (fdb_kvs_handle **)0x118661;
    sprintf(acStack_2eb0,"key%d",uVar23 & 0xffffffff);
    ppfStack_3118 = (fdb_kvs_handle **)0x11867d;
    sprintf(acStack_2cb0,"meta%d",uVar23 & 0xffffffff);
    ptr_fhandle = apfStack_2db0;
    ppfStack_3118 = (fdb_kvs_handle **)0x118699;
    sprintf((char *)ptr_fhandle,"body%d",uVar23 & 0xffffffff);
    ppfStack_3118 = (fdb_kvs_handle **)0x1186a1;
    ppfVar13 = (fdb_kvs_handle **)strlen(acStack_2eb0);
    ppfStack_3118 = (fdb_kvs_handle **)0x1186ac;
    sVar7 = strlen(acStack_2cb0);
    ppfStack_3118 = (fdb_kvs_handle **)0x1186b7;
    sVar8 = strlen((char *)ptr_fhandle);
    ppfStack_3118 = (fdb_kvs_handle **)0x1186d7;
    fdb_doc_create(ppfVar25,acStack_2eb0,(size_t)ppfVar13,acStack_2cb0,sVar7,ptr_fhandle,sVar8);
    uVar23 = uVar23 + 1;
    ppfVar25 = ppfVar25 + 1;
  } while (uVar23 != 0x1e);
  ppfStack_3118 = (fdb_kvs_handle **)0x1186f7;
  fdb_set(pfStack_30f8,apfStack_30b0[0]);
  ppfStack_3118 = (fdb_kvs_handle **)0x118706;
  fdb_set(pfStack_30f8,apfStack_30b0[1]);
  ppfStack_3118 = (fdb_kvs_handle **)0x118715;
  fdb_begin_transaction((fdb_file_handle *)auStack_30f0._0_8_,'\x02');
  lVar16 = 0;
  do {
    ppfStack_3118 = (fdb_kvs_handle **)0x118726;
    fdb_set((fdb_kvs_handle *)auStack_30f0._8_8_,apfStack_30b0[lVar16 + 2]);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 2);
  ppfStack_3118 = (fdb_kvs_handle **)0x118741;
  fdb_commit((fdb_file_handle *)auStack_30f0._16_8_,'\x01');
  ppfStack_3118 = (fdb_kvs_handle **)0x118749;
  fdb_close((fdb_file_handle *)auStack_30f0._16_8_);
  ppfStack_3118 = (fdb_kvs_handle **)0x118756;
  fdb_close((fdb_file_handle *)auStack_30f0._0_8_);
  ptr_handle = (fdb_kvs_handle **)0x1541a5;
  pfVar17 = &fStack_2fa8;
  ppfStack_3118 = (fdb_kvs_handle **)0x118773;
  fdb_open((fdb_file_handle **)(auStack_30f0 + 0x10),"dummy1",pfVar17);
  ppfStack_3118 = (fdb_kvs_handle **)0x118781;
  fdb_open((fdb_file_handle **)auStack_30f0,"dummy1",pfVar17);
  ppfStack_3118 = (fdb_kvs_handle **)0x118796;
  fdb_kvs_open_default((fdb_file_handle *)auStack_30f0._16_8_,&pfStack_30f8,&fStack_30c8);
  ppfStack_3118 = (fdb_kvs_handle **)0x1187a6;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_30f0._0_8_,(fdb_kvs_handle **)(auStack_30f0 + 8),
             &fStack_30c8);
  uVar23 = 0;
  do {
    ppfStack_3118 = (fdb_kvs_handle **)0x1187d2;
    fdb_doc_create(&pfStack_3100,apfStack_30b0[uVar23]->key,apfStack_30b0[uVar23]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_3118 = (fdb_kvs_handle **)0x1187e1;
    fVar5 = fdb_get(pfStack_30f8,pfStack_3100);
    if (uVar23 < 2) {
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00118d89;
    }
    else if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00118d8e;
    ppfStack_3118 = (fdb_kvs_handle **)0x118802;
    fdb_doc_free(pfStack_3100);
    pfStack_3100 = (fdb_doc *)0x0;
    uVar23 = uVar23 + 1;
  } while (uVar23 != 4);
  ppfStack_3118 = (fdb_kvs_handle **)0x118823;
  fdb_begin_transaction((fdb_file_handle *)auStack_30f0._0_8_,'\x02');
  lVar16 = 0;
  do {
    ppfStack_3118 = (fdb_kvs_handle **)0x118834;
    fdb_set((fdb_kvs_handle *)auStack_30f0._8_8_,apfStack_30b0[lVar16 + 2]);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 2);
  lVar16 = 0;
  do {
    ppfStack_3118 = (fdb_kvs_handle **)0x118851;
    fdb_set(pfStack_30f8,apfStack_30b0[lVar16 + 4]);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 2);
  ppfStack_3118 = (fdb_kvs_handle **)0x11886c;
  fdb_end_transaction((fdb_file_handle *)auStack_30f0._0_8_,'\x01');
  ppfStack_3118 = (fdb_kvs_handle **)0x118879;
  fdb_close((fdb_file_handle *)auStack_30f0._16_8_);
  ppfStack_3118 = (fdb_kvs_handle **)0x118881;
  fdb_close((fdb_file_handle *)auStack_30f0._0_8_);
  ptr_handle = (fdb_kvs_handle **)0x1541a5;
  pfVar17 = &fStack_2fa8;
  ppfStack_3118 = (fdb_kvs_handle **)0x11889e;
  fdb_open((fdb_file_handle **)(auStack_30f0 + 0x10),"dummy1",pfVar17);
  ppfStack_3118 = (fdb_kvs_handle **)0x1188ac;
  fdb_open((fdb_file_handle **)auStack_30f0,"dummy1",pfVar17);
  ppfStack_3118 = (fdb_kvs_handle **)0x1188c1;
  fdb_kvs_open_default((fdb_file_handle *)auStack_30f0._16_8_,&pfStack_30f8,&fStack_30c8);
  ppfStack_3118 = (fdb_kvs_handle **)0x1188d1;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_30f0._0_8_,(fdb_kvs_handle **)(auStack_30f0 + 8),
             &fStack_30c8);
  uVar23 = 0;
  do {
    ppfStack_3118 = (fdb_kvs_handle **)0x1188fd;
    fdb_doc_create(&pfStack_3100,apfStack_30b0[uVar23]->key,apfStack_30b0[uVar23]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_3118 = (fdb_kvs_handle **)0x11890c;
    fVar5 = fdb_get(pfStack_30f8,pfStack_3100);
    if ((uVar23 < 4) && (fVar5 != FDB_RESULT_SUCCESS)) {
      ppfStack_3118 = (fdb_kvs_handle **)0x118d84;
      last_wal_flush_header_test();
      goto LAB_00118d84;
    }
    ppfStack_3118 = (fdb_kvs_handle **)0x118924;
    fdb_doc_free(pfStack_3100);
    pfStack_3100 = (fdb_doc *)0x0;
    uVar23 = uVar23 + 1;
  } while (uVar23 != 6);
  lVar16 = 0;
  do {
    ppfStack_3118 = (fdb_kvs_handle **)0x11894a;
    fdb_set(pfStack_30f8,apfStack_30b0[lVar16 + 4]);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 2);
  ppfStack_3118 = (fdb_kvs_handle **)0x118962;
  fdb_begin_transaction((fdb_file_handle *)auStack_30f0._0_8_,'\x02');
  lVar16 = 0;
  do {
    ppfStack_3118 = (fdb_kvs_handle **)0x118976;
    fdb_set((fdb_kvs_handle *)auStack_30f0._8_8_,apfStack_30b0[lVar16 + 6]);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 2);
  ppfStack_3118 = (fdb_kvs_handle **)0x11898e;
  fdb_commit((fdb_file_handle *)auStack_30f0._16_8_,'\x01');
  ppfStack_3118 = (fdb_kvs_handle **)0x1189aa;
  fdb_open(&pfStack_30d8,"dummy1",&fStack_2fa8);
  ppfStack_3118 = (fdb_kvs_handle **)0x1189bc;
  fdb_kvs_open_default(pfStack_30d8,&pfStack_30d0,&fStack_30c8);
  ppfStack_3118 = (fdb_kvs_handle **)0x1189c9;
  fdb_begin_transaction(pfStack_30d8,'\x02');
  lVar16 = 0;
  do {
    ppfStack_3118 = (fdb_kvs_handle **)0x1189dd;
    fdb_set(pfStack_30d0,apfStack_30b0[lVar16 + 8]);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 2);
  ppfStack_3118 = (fdb_kvs_handle **)0x1189f5;
  fdb_end_transaction(pfStack_30d8,'\x01');
  ppfStack_3118 = (fdb_kvs_handle **)0x118a02;
  fdb_close((fdb_file_handle *)auStack_30f0._16_8_);
  ppfStack_3118 = (fdb_kvs_handle **)0x118a0c;
  fdb_close((fdb_file_handle *)auStack_30f0._0_8_);
  ppfStack_3118 = (fdb_kvs_handle **)0x118a16;
  fdb_close(pfStack_30d8);
  ppfStack_3118 = (fdb_kvs_handle **)0x118a2d;
  fdb_open((fdb_file_handle **)(auStack_30f0 + 0x10),"dummy1",&fStack_2fa8);
  ppfStack_3118 = (fdb_kvs_handle **)0x118a3f;
  fdb_kvs_open_default((fdb_file_handle *)auStack_30f0._16_8_,&pfStack_30f8,&fStack_30c8);
  uVar23 = 0;
  do {
    ppfStack_3118 = (fdb_kvs_handle **)0x118a6b;
    fdb_doc_create(&pfStack_3100,apfStack_30b0[uVar23]->key,apfStack_30b0[uVar23]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_3118 = (fdb_kvs_handle **)0x118a7a;
    fVar5 = fdb_get(pfStack_30f8,pfStack_3100);
    if ((int)uVar23 - 8U < 0xfffffffe) {
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00118d93;
    }
    else if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00118d98;
    ppfStack_3118 = (fdb_kvs_handle **)0x118a9e;
    fdb_doc_free(pfStack_3100);
    pfStack_3100 = (fdb_doc *)0x0;
    uVar23 = uVar23 + 1;
  } while (uVar23 != 10);
  pfVar17 = (fdb_config *)auStack_30f0;
  ppfStack_3118 = (fdb_kvs_handle **)0x118ad2;
  fdb_open((fdb_file_handle **)pfVar17,"dummy1",&fStack_2fa8);
  ptr_fhandle = &pfStack_30d8;
  ppfStack_3118 = (fdb_kvs_handle **)0x118ae5;
  fdb_open(ptr_fhandle,"dummy1",&fStack_2fa8);
  ptr_handle = (fdb_kvs_handle **)(auStack_30f0 + 8);
  ppfStack_3118 = (fdb_kvs_handle **)0x118afe;
  fdb_kvs_open_default((fdb_file_handle *)auStack_30f0._0_8_,ptr_handle,&fStack_30c8);
  ppfStack_3118 = (fdb_kvs_handle **)0x118b12;
  fdb_kvs_open_default(pfStack_30d8,&pfStack_30d0,&fStack_30c8);
  ppfStack_3118 = (fdb_kvs_handle **)0x118b20;
  fdb_begin_transaction((fdb_file_handle *)auStack_30f0._0_8_,'\x02');
  ppfVar13 = &pfStack_30f8;
  ppfStack_3118 = (fdb_kvs_handle **)0x118b36;
  fdb_set(pfStack_30f8,apfStack_30b0[10]);
  ppfStack_3118 = (fdb_kvs_handle **)0x118b48;
  fdb_commit((fdb_file_handle *)auStack_30f0._16_8_,'\x01');
  ppfStack_3118 = (fdb_kvs_handle **)0x118b59;
  fdb_set(pfStack_30f8,apfStack_30b0[0xb]);
  ppfStack_3118 = (fdb_kvs_handle **)0x118b69;
  fdb_set((fdb_kvs_handle *)auStack_30f0._8_8_,apfStack_30b0[0xc]);
  ppfStack_3118 = (fdb_kvs_handle **)0x118b76;
  fdb_commit((fdb_file_handle *)auStack_30f0._16_8_,'\x01');
  ppfStack_3118 = (fdb_kvs_handle **)0x118b86;
  fdb_set((fdb_kvs_handle *)auStack_30f0._8_8_,apfStack_30b0[0xd]);
  ppfStack_3118 = (fdb_kvs_handle **)0x118b94;
  fdb_begin_transaction(pfStack_30d8,'\x02');
  ppfStack_3118 = (fdb_kvs_handle **)0x118ba4;
  fdb_set(pfStack_30d0,apfStack_30b0[0xe]);
  ppfStack_3118 = (fdb_kvs_handle **)0x118bb2;
  fdb_end_transaction((fdb_file_handle *)auStack_30f0._0_8_,'\x01');
  ppfStack_3118 = (fdb_kvs_handle **)0x118bc2;
  fdb_set(pfStack_30d0,apfStack_30b0[0xf]);
  ppfStack_3118 = (fdb_kvs_handle **)0x118bd3;
  fdb_set(pfStack_30f8,apfStack_30b0[0x10]);
  ppfStack_3118 = (fdb_kvs_handle **)0x118be1;
  fdb_end_transaction(pfStack_30d8,'\x01');
  ppfStack_3118 = (fdb_kvs_handle **)0x118bf2;
  fdb_set(pfStack_30f8,apfStack_30b0[0x11]);
  uVar23 = 0;
  ppfStack_3118 = (fdb_kvs_handle **)0x118bff;
  fdb_commit((fdb_file_handle *)auStack_30f0._16_8_,'\0');
  ppfStack_3118 = (fdb_kvs_handle **)0x118c07;
  fdb_close((fdb_file_handle *)auStack_30f0._16_8_);
  ppfStack_3118 = (fdb_kvs_handle **)0x118c10;
  fdb_close((fdb_file_handle *)auStack_30f0._0_8_);
  ppfStack_3118 = (fdb_kvs_handle **)0x118c19;
  fdb_close(pfStack_30d8);
  ppfStack_3118 = (fdb_kvs_handle **)0x118c30;
  fdb_open((fdb_file_handle **)(auStack_30f0 + 0x10),"dummy1",&fStack_2fa8);
  ppfStack_3118 = (fdb_kvs_handle **)0x118c40;
  fdb_kvs_open_default((fdb_file_handle *)auStack_30f0._16_8_,ppfVar13,&fStack_30c8);
  while( true ) {
    ppfStack_3118 = (fdb_kvs_handle **)0x118c6c;
    fdb_doc_create(&pfStack_3100,apfStack_30b0[uVar23 + 10]->key,apfStack_30b0[uVar23 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_3118 = (fdb_kvs_handle **)0x118c7b;
    fVar5 = fdb_get(pfStack_30f8,pfStack_3100);
    if (fVar5 != FDB_RESULT_SUCCESS) break;
    ppfStack_3118 = (fdb_kvs_handle **)0x118c8d;
    fdb_doc_free(pfStack_3100);
    pfStack_3100 = (fdb_doc *)0x0;
    uVar23 = uVar23 + 1;
    if (uVar23 == 8) {
      ppfStack_3118 = (fdb_kvs_handle **)0x118cbb;
      fdb_open((fdb_file_handle **)auStack_30f0,"dummy1",&fStack_2fa8);
      ppfStack_3118 = (fdb_kvs_handle **)0x118cd0;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_30f0._0_8_,(fdb_kvs_handle **)(auStack_30f0 + 8),
                 &fStack_30c8);
      ppfStack_3118 = (fdb_kvs_handle **)0x118cdd;
      fdb_begin_transaction((fdb_file_handle *)auStack_30f0._0_8_,'\x02');
      ppfStack_3118 = (fdb_kvs_handle **)0x118ced;
      fdb_set((fdb_kvs_handle *)auStack_30f0._8_8_,apfStack_30b0[0x14]);
      ppfStack_3118 = (fdb_kvs_handle **)0x118cfe;
      fdb_compact((fdb_file_handle *)auStack_30f0._16_8_,"dummy2");
      ppfStack_3118 = (fdb_kvs_handle **)0x118d0b;
      fdb_end_transaction((fdb_file_handle *)auStack_30f0._0_8_,'\x01');
      ppfStack_3118 = (fdb_kvs_handle **)0x118d15;
      fdb_close((fdb_file_handle *)auStack_30f0._16_8_);
      ppfStack_3118 = (fdb_kvs_handle **)0x118d1d;
      fdb_close((fdb_file_handle *)auStack_30f0._0_8_);
      lVar16 = 0;
      do {
        ppfStack_3118 = (fdb_kvs_handle **)0x118d29;
        fdb_doc_free(apfStack_30b0[lVar16]);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x1e);
      ppfStack_3118 = (fdb_kvs_handle **)0x118d37;
      fdb_shutdown();
      ppfStack_3118 = (fdb_kvs_handle **)0x118d3c;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      ppfStack_3118 = (fdb_kvs_handle **)0x118d6d;
      fprintf(_stderr,pcVar21,"last wal flush header test");
      return;
    }
  }
LAB_00118d84:
  ppfStack_3118 = (fdb_kvs_handle **)0x118d89;
  last_wal_flush_header_test();
LAB_00118d89:
  ppfStack_3118 = (fdb_kvs_handle **)0x118d8e;
  last_wal_flush_header_test();
LAB_00118d8e:
  ppfStack_3118 = (fdb_kvs_handle **)0x118d93;
  last_wal_flush_header_test();
LAB_00118d93:
  ppfStack_3118 = (fdb_kvs_handle **)0x118d98;
  last_wal_flush_header_test();
LAB_00118d98:
  ppfStack_3118 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_19360 = (fdb_doc *)0x118dba;
  ppfStack_3140 = &pfStack_3100;
  pfStack_3138 = pfVar17;
  ppfStack_3130 = ptr_fhandle;
  uStack_3128 = uVar23;
  ppfStack_3120 = ptr_handle;
  ppfStack_3118 = ppfVar13;
  gettimeofday(&tStack_192f8,(__timezone_ptr_t)0x0);
  pfStack_19360 = (fdb_doc *)0x118dbf;
  memleak_start();
  pfStack_19348 = (fdb_doc *)0x0;
  pfStack_19360 = (fdb_doc *)0x118dd4;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_19360 = (fdb_doc *)0x118de4;
  fdb_get_default_config();
  pfStack_19360 = (fdb_doc *)0x118df1;
  fdb_get_default_kvs_config();
  fStack_19080.flags = 1;
  fStack_19080.purging_interval = 0;
  fStack_19080.compaction_threshold = '\0';
  fStack_19080.durability_opt = '\x02';
  pfStack_19360 = (fdb_doc *)0x118e1e;
  fdb_open(&pfStack_19340,"dummy1",&fStack_19080);
  pfStack_19360 = (fdb_doc *)0x118e2e;
  fdb_kvs_open_default(pfStack_19340,&pfStack_19330,&fStack_192e8);
  ppfVar25 = apfStack_18e88;
  pfVar12 = afStack_19288;
  pfVar18 = (fdb_doc *)0x0;
  lVar16 = 0;
  do {
    sVar7 = 0xff7f;
    if (lVar16 == 1) {
      sVar7 = 0x1fff;
    }
    if (lVar16 == 0) {
      sVar7 = 0x7fff;
    }
    pfStack_19360 = (fdb_doc *)0x118e7c;
    lStack_19328 = lVar16;
    memset(asStack_130c8,0x5f,sVar7);
    *(undefined1 *)((long)asStack_130c8 + sVar7) = 0;
    lVar16 = 0;
    doc_00 = ppfVar25;
    lStack_19320 = (long)pfVar18;
    ppfStack_19318 = ppfVar25;
    sStack_19300 = sVar7;
    do {
      pfStack_19360 = (fdb_doc *)0x118eb2;
      lStack_19310 = lVar16;
      sprintf((char *)pfVar12,"%08d");
      asStack_130c8[0] = afStack_19288[0].keylen;
      uVar23 = 0;
      lStack_19338 = (long)pfVar18;
      ppfStack_19308 = doc_00;
      do {
        pfStack_19360 = (fdb_doc *)0x118eee;
        sprintf((char *)pfVar12,"%08d",uVar23 & 0xffffffff);
        *(size_t *)((long)apfStack_18e88 + sStack_19300 + 0x5db8) = afStack_19288[0].keylen;
        uVar20 = (int)lStack_19338 + (int)uVar23;
        pfStack_19360 = (fdb_doc *)0x118f27;
        sprintf(acStack_18f88,"meta%d",(ulong)uVar20);
        pfStack_19360 = (fdb_doc *)0x118f3a;
        sprintf(acStack_19188,"body%d",(ulong)uVar20);
        pfStack_19360 = (fdb_doc *)0x118f47;
        sVar7 = strlen((char *)asStack_130c8);
        pfStack_19360 = (fdb_doc *)0x118f53;
        sVar8 = strlen(acStack_18f88);
        pfStack_19360 = (fdb_doc *)0x118f67;
        sVar11 = strlen(acStack_19188);
        lVar3 = lStack_19338;
        pcVar21 = acStack_19188;
        pfStack_19360 = (fdb_doc *)0x118f9a;
        fdb_doc_create(doc_00,asStack_130c8,sVar7 + 1,acStack_18f88,sVar8 + 1,pcVar21,sVar11 + 1);
        uVar23 = uVar23 + 1;
        doc_00 = doc_00 + 1;
      } while (uVar23 != 10);
      lVar16 = lStack_19310 + 1;
      doc_00 = ppfStack_19308 + 10;
      pfVar18 = (fdb_doc *)(lVar3 + 10);
    } while (lVar16 != 100);
    lVar16 = lStack_19328 + 1;
    ppfVar25 = ppfStack_19318 + 1000;
    pfVar18 = (fdb_doc *)(lStack_19320 + 1000);
  } while (lVar16 != 3);
  lVar16 = 0;
  do {
    pfStack_19360 = (fdb_doc *)0x119010;
    fdb_set(pfStack_19330,apfStack_18e88[lVar16]);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3000);
  pfStack_19360 = (fdb_doc *)0x11902b;
  fdb_commit(pfStack_19340,'\x01');
  pfStack_19360 = (fdb_doc *)0x119040;
  fdb_get_file_info(pfStack_19340,&fStack_192d0);
  if (fStack_192d0.doc_count != 3000) {
    pfStack_19360 = (fdb_doc *)0x119057;
    long_key_test();
  }
  lVar16 = 0;
  while( true ) {
    pfStack_19360 = (fdb_doc *)0x119086;
    fdb_doc_create(&pfStack_19348,apfStack_18e88[lVar16]->key,apfStack_18e88[lVar16]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_19360 = (fdb_doc *)0x119095;
    fVar5 = fdb_get(pfStack_19330,pfStack_19348);
    pfVar24 = pfStack_19348;
    if (fVar5 != FDB_RESULT_SUCCESS) break;
    doc_00 = (fdb_doc **)pfStack_19348->key;
    pfVar12 = apfStack_18e88[lVar16];
    pcVar21 = (char *)pfVar12->key;
    pfStack_19360 = (fdb_doc *)0x1190c0;
    iVar6 = bcmp(doc_00,pcVar21,pfStack_19348->keylen);
    pfVar18 = pfVar24;
    if (iVar6 != 0) {
      pfStack_19360 = (fdb_doc *)0x1191a4;
      long_key_test();
      break;
    }
    doc_00 = (fdb_doc **)pfVar24->meta;
    pcVar21 = (char *)pfVar12->meta;
    pfStack_19360 = (fdb_doc *)0x1190df;
    iVar6 = bcmp(doc_00,pcVar21,pfVar24->metalen);
    if (iVar6 != 0) goto LAB_001191b4;
    doc_00 = (fdb_doc **)pfVar24->body;
    pcVar21 = (char *)pfVar12->body;
    pfStack_19360 = (fdb_doc *)0x1190fe;
    iVar6 = bcmp(doc_00,pcVar21,pfVar24->bodylen);
    if (iVar6 != 0) goto LAB_001191a9;
    pfStack_19360 = (fdb_doc *)0x11910e;
    fdb_doc_free(pfVar24);
    pfStack_19348 = (fdb_doc *)0x0;
    lVar16 = lVar16 + 1;
    if (lVar16 == 3000) {
      pfStack_19360 = (fdb_doc *)0x119131;
      fdb_close(pfStack_19340);
      lVar16 = 0;
      do {
        pfStack_19360 = (fdb_doc *)0x119140;
        fdb_doc_free(apfStack_18e88[lVar16]);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3000);
      pfStack_19360 = (fdb_doc *)0x119151;
      fdb_shutdown();
      pfStack_19360 = (fdb_doc *)0x119156;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_19360 = (fdb_doc *)0x119187;
      fprintf(_stderr,pcVar21,"long key test");
      return;
    }
  }
  pfStack_19360 = (fdb_doc *)0x1191a9;
  long_key_test();
LAB_001191a9:
  pfStack_19360 = (fdb_doc *)0x1191b4;
  long_key_test();
LAB_001191b4:
  pfStack_19360 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1d858 = (fdb_kvs_handle *)0x1191df;
  ppfStack_19388 = &pfStack_19348;
  pcStack_19380 = pcVar21;
  lStack_19378 = lVar16;
  pfStack_19370 = pfVar18;
  ppfStack_19368 = doc_00;
  pfStack_19360 = pfVar12;
  gettimeofday((timeval *)(auStack_1d7d0 + 0x30),(__timezone_ptr_t)0x0);
  pfStack_1d858 = (fdb_kvs_handle *)0x1191e4;
  memleak_start();
  pfStack_1d858 = (fdb_kvs_handle *)0x1191f0;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1d858 = (fdb_kvs_handle *)0x119200;
  fdb_get_default_config();
  pfStack_1d858 = (fdb_kvs_handle *)0x11920a;
  fdb_get_default_kvs_config();
  fStack_1d688.wal_threshold = 0x400;
  fStack_1d688.compaction_mode = '\0';
  fStack_1d688.durability_opt = '\x02';
  pcVar26 = (char *)&fStack_1d390;
  doc = apfStack_1d590;
  pcVar21 = "kvs%d";
  uVar23 = 0;
  ptr_iterator = (fdb_iterator **)0x0;
  do {
    pfStack_1d858 = (fdb_kvs_handle *)0x11924a;
    sprintf((char *)doc,"dummy%d",(ulong)ptr_iterator & 0xffffffff);
    pcVar19 = (char *)(apfStack_1d810 + (long)ptr_iterator);
    pfStack_1d858 = (fdb_kvs_handle *)0x119265;
    fVar5 = fdb_open((fdb_file_handle **)pcVar19,(char *)doc,&fStack_1d688);
    pfVar15 = (fdb_kvs_handle *)pcVar26;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011969e;
    ppfVar4 = (fdb_iterator **)0x0;
    ppfStack_1d838 = ptr_iterator;
    pfStack_1d830 = (fdb_kvs_handle *)pcVar26;
    do {
      ptr_iterator = ppfVar4;
      pfStack_1d858 = (fdb_kvs_handle *)0x11928b;
      sprintf((char *)doc,"kvs%d",(ulong)(uint)((int)ptr_iterator + (int)uVar23));
      pfStack_1d858 = (fdb_kvs_handle *)0x11929e;
      fVar5 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)pcVar19,(fdb_kvs_handle **)pcVar26
                           ,(char *)doc,&fStack_1d828);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_1d858 = (fdb_kvs_handle *)0x11968a;
        open_multi_files_kvs_test();
        goto LAB_0011968a;
      }
      pcVar26 = (char *)&(((fdb_kvs_handle *)pcVar26)->kvs_config).custom_cmp;
      ppfVar4 = (fdb_iterator **)((long)ptr_iterator + 1);
    } while ((fdb_iterator **)((long)ptr_iterator + 1) != (fdb_iterator **)0x80);
    ptr_iterator = (fdb_iterator **)((long)ppfStack_1d838 + 1);
    uVar23 = uVar23 + 0x80;
    pcVar26 = (char *)&pfStack_1d830[1].bub_ctx.space_used;
  } while (ptr_iterator != (fdb_iterator **)0x8);
  ptr_iterator = apfStack_1d790;
  doc = apfStack_1d490;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    uVar23 = 0;
    do {
      pfStack_1d858 = (fdb_kvs_handle *)0x119300;
      sprintf((char *)ptr_iterator,"key%08d",uVar23);
      pfStack_1d858 = (fdb_kvs_handle *)0x119313;
      sprintf((char *)doc,"value%08d",uVar23);
      pcVar21 = *(char **)(&fStack_1d390.kvs_config.create_if_missing + (long)pfVar15 * 8);
      pfStack_1d858 = (fdb_kvs_handle *)0x119323;
      sVar7 = strlen((char *)ptr_iterator);
      pcVar19 = (char *)(sVar7 + 1);
      pfStack_1d858 = (fdb_kvs_handle *)0x11932f;
      sVar7 = strlen((char *)doc);
      pfStack_1d858 = (fdb_kvs_handle *)0x119344;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)pcVar21,ptr_iterator,(size_t)pcVar19,doc,sVar7 + 1);
      pcVar26 = (char *)pfVar15;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011968a;
      uVar20 = (int)uVar23 + 1;
      uVar23 = (ulong)uVar20;
    } while (uVar20 != 10);
    pfVar15 = (fdb_kvs_handle *)&(pfVar15->kvs_config).field_0x1;
  } while (pfVar15 != (fdb_kvs_handle *)0x400);
  pcVar19 = (char *)0x0;
  do {
    if (((ulong)pcVar19 & 1) == 0) {
      pfStack_1d858 = (fdb_kvs_handle *)0x119372;
      fVar5 = fdb_commit((fdb_file_handle *)apfStack_1d810[(long)pcVar19],'\0');
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001196bc;
    }
    else {
      pfStack_1d858 = (fdb_kvs_handle *)0x119385;
      fVar5 = fdb_commit((fdb_file_handle *)apfStack_1d810[(long)pcVar19],'\x01');
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001196c1;
    }
    pcVar19 = (char *)((long)pcVar19 + 1);
  } while ((fdb_kvs_handle **)pcVar19 != (fdb_kvs_handle **)0x8);
  doc = (fdb_iterator **)0xffffffffffffff80;
  pcVar19 = (char *)apfStack_1b390;
  ptr_iterator = (fdb_iterator **)(auStack_1d7d0 + 8);
  pfVar15 = (fdb_kvs_handle *)auStack_1d7d0;
  do {
    pfStack_1d858 = (fdb_kvs_handle *)0x1193c5;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1cf90[(long)doc],(fdb_kvs_info *)pfVar15);
    if ((fdb_custom_cmp_variable)auStack_1d7d0._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1d858 = (fdb_kvs_handle *)0x11940b;
      open_multi_files_kvs_test();
    }
    pfStack_1d858 = (fdb_kvs_handle *)0x1193e5;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1cf90[(long)doc],(fdb_kvs_handle **)pcVar19,
                              10);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001196a3;
    doc = doc + 0x10;
    pcVar19 = (char *)((long)pcVar19 + 0x400);
  } while (doc < (fdb_iterator **)0x380);
  pcVar19 = (char *)0x0;
  do {
    pfStack_1d858 = (fdb_kvs_handle *)0x11941b;
    fVar5 = fdb_compact((fdb_file_handle *)apfStack_1d810[(long)pcVar19],(char *)0x0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001196a8;
    pcVar19 = (char *)((long)pcVar19 + 1);
  } while ((fdb_kvs_handle **)pcVar19 != (fdb_kvs_handle **)0x8);
  pcVar19 = (char *)&pfStack_1d840;
  pfStack_1d840 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1d848;
  pcVar26 = "key%08d";
  doc = apfStack_1d790;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1d858 = (fdb_kvs_handle *)0x119470;
    fdb_iterator_init(apfStack_1b390[(long)pfVar15],ptr_iterator,(void *)0x0,0,(void *)0x0,0,0);
    uVar23 = 0;
    do {
      pfStack_1d858 = (fdb_kvs_handle *)0x11947f;
      fVar5 = fdb_iterator_get(pfStack_1d848,(fdb_doc **)pcVar19);
      pcVar21 = (char *)pfVar15;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011968f;
      pfStack_1d858 = (fdb_kvs_handle *)0x119496;
      sprintf((char *)doc,"key%08d",uVar23);
      pfStack_1d858 = (fdb_kvs_handle *)0x1194a7;
      iVar6 = strcmp((char *)doc,(char *)pfStack_1d840->op_stats);
      if (iVar6 != 0) {
        pfStack_1d858 = (fdb_kvs_handle *)0x1194c9;
        open_multi_files_kvs_test();
      }
      uVar23 = (ulong)((int)uVar23 + 1);
      pfStack_1d858 = (fdb_kvs_handle *)0x1194b7;
      fVar5 = fdb_iterator_next(pfStack_1d848);
    } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1d858 = (fdb_kvs_handle *)0x1194d5;
    fdb_iterator_close(pfStack_1d848);
    pcVar21 = (char *)&(pfVar15->config).wal_threshold;
    bVar27 = pfVar15 < (fdb_kvs_handle *)0x380;
    pfVar15 = (fdb_kvs_handle *)pcVar21;
  } while (bVar27);
  pfStack_1d858 = (fdb_kvs_handle *)0x1194f6;
  fdb_doc_free((fdb_doc *)pfStack_1d840);
  pcVar19 = "key%08d";
  ptr_iterator = apfStack_1d790;
  doc = (fdb_iterator **)0x0;
  do {
    uVar23 = 0;
    do {
      pfStack_1d858 = (fdb_kvs_handle *)0x119519;
      sprintf((char *)ptr_iterator,"key%08d",uVar23);
      pcVar26 = *(char **)(&fStack_1d390.kvs_config.create_if_missing + (long)doc * 8);
      pfStack_1d858 = (fdb_kvs_handle *)0x119529;
      sVar7 = strlen((char *)ptr_iterator);
      pfStack_1d858 = (fdb_kvs_handle *)0x119538;
      fVar5 = fdb_del_kv((fdb_kvs_handle *)pcVar26,ptr_iterator,sVar7 + 1);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119694;
      uVar20 = (int)uVar23 + 1;
      uVar23 = (ulong)uVar20;
    } while (uVar20 != 10);
    doc = (fdb_iterator **)((long)doc + 1);
  } while (doc != (fdb_iterator **)0x400);
  pcVar19 = "dummy_compact%d";
  ptr_iterator = apfStack_1d590;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1d858 = (fdb_kvs_handle *)0x119575;
    sprintf((char *)ptr_iterator,"dummy_compact%d",(ulong)pfVar15 & 0xffffffff);
    pfStack_1d858 = (fdb_kvs_handle *)0x119582;
    fVar5 = fdb_compact((fdb_file_handle *)apfStack_1d810[(long)pfVar15],(char *)ptr_iterator);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001196ad;
    pfVar15 = (fdb_kvs_handle *)&(pfVar15->kvs_config).field_0x1;
  } while (pfVar15 != (fdb_kvs_handle *)0x8);
  pcVar19 = (char *)&pfStack_1d840;
  pfStack_1d840 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1d848;
  pcVar26 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1d858 = (fdb_kvs_handle *)0x1195c8;
    fVar5 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1d390.kvs_config.create_if_missing + (long)pcVar26 * 8),
                              ptr_iterator,(void *)0x0,0,(void *)0x0,0,2);
    pfVar15 = (fdb_kvs_handle *)pcVar26;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001196b2;
    do {
      pfStack_1d858 = (fdb_kvs_handle *)0x1195dd;
      fVar5 = fdb_iterator_get(pfStack_1d848,(fdb_doc **)pcVar19);
      if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00119699;
      pfStack_1d858 = (fdb_kvs_handle *)0x1195ef;
      fVar5 = fdb_iterator_next(pfStack_1d848);
    } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1d858 = (fdb_kvs_handle *)0x1195fe;
    fdb_iterator_close(pfStack_1d848);
    pfVar15 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)pcVar26)->config).wal_threshold;
    bVar27 = pcVar26 < (fdb_kvs_handle *)0x380;
    pcVar26 = (char *)pfVar15;
  } while (bVar27);
  pfStack_1d858 = (fdb_kvs_handle *)0x11961b;
  fdb_doc_free((fdb_doc *)pfStack_1d840);
  pcVar19 = (char *)0x0;
  while( true ) {
    pfStack_1d858 = (fdb_kvs_handle *)0x119627;
    fVar5 = fdb_close((fdb_file_handle *)apfStack_1d810[(long)pcVar19]);
    if (fVar5 != FDB_RESULT_SUCCESS) break;
    pcVar19 = (char *)((long)pcVar19 + 1);
    if ((fdb_kvs_handle **)pcVar19 == (fdb_kvs_handle **)0x8) {
      pfStack_1d858 = (fdb_kvs_handle *)0x11963d;
      fdb_shutdown();
      pfStack_1d858 = (fdb_kvs_handle *)0x119642;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_1d858 = (fdb_kvs_handle *)0x119673;
      fprintf(_stderr,pcVar21,"open multi files kvs test");
      return;
    }
  }
LAB_001196b7:
  pfStack_1d858 = (fdb_kvs_handle *)0x1196bc;
  open_multi_files_kvs_test();
LAB_001196bc:
  pfStack_1d858 = (fdb_kvs_handle *)0x1196c1;
  open_multi_files_kvs_test();
LAB_001196c1:
  pfStack_1d858 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1dbd0 = (code *)0x1196e0;
  ppfStack_1d870 = (fdb_kvs_handle **)pcVar19;
  ppfStack_1d868 = doc;
  ppfStack_1d860 = ptr_iterator;
  pfStack_1d858 = pfVar15;
  gettimeofday(&tStack_1db80,(__timezone_ptr_t)0x0);
  pcStack_1dbd0 = (code *)0x1196e5;
  memleak_start();
  pcStack_1dbd0 = (code *)0x1196f1;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar17 = &fStack_1db70;
  pcStack_1dbd0 = (code *)0x1196fe;
  fdb_get_default_config();
  pcStack_1dbd0 = (code *)0x119708;
  fdb_get_default_kvs_config();
  pcStack_1dbd0 = (code *)0x11971c;
  fVar5 = fdb_open(&pfStack_1dbb0,"./dummy1",pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pcStack_1dbd0 = (code *)0x11973f;
    fVar5 = fdb_kvs_open(pfStack_1dbb0,&pfStack_1dba8,"db",&fStack_1db98);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001198f2;
    pcStack_1dbd0 = (code *)0x119762;
    fVar5 = fdb_kvs_open(pfStack_1dbb0,&pfStack_1dba0,"db2",&fStack_1db98);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001198f7;
    pfVar17 = &fStack_1d978;
    pcStack_1dbd0 = (code *)0x119785;
    sprintf((char *)pfVar17,"key%d",0);
    ptr_iterator = apfStack_1da78;
    pcStack_1dbd0 = (code *)0x1197a0;
    sprintf((char *)ptr_iterator,"body%d",0);
    pcStack_1dbd0 = (code *)0x1197a8;
    pfVar15 = (fdb_kvs_handle *)strlen((char *)pfVar17);
    pcStack_1dbd0 = (code *)0x1197b3;
    sVar7 = strlen((char *)ptr_iterator);
    doc = &pfStack_1dbb8;
    pcStack_1dbd0 = (code *)0x1197d5;
    fdb_doc_create((fdb_doc **)doc,pfVar17,(size_t)pfVar15,(void *)0x0,0,ptr_iterator,sVar7 + 1);
    pcStack_1dbd0 = (code *)0x1197e3;
    fVar5 = fdb_set(pfStack_1dba8,(fdb_doc *)pfStack_1dbb8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001198fc;
    pcStack_1dbd0 = (code *)0x1197fa;
    fVar5 = fdb_commit(pfStack_1dbb0,'\x01');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119901;
    pcStack_1dbd0 = (code *)0x11981b;
    sprintf((char *)pfStack_1dbb8->tree_cursor_prev,"bOdy%d",0);
    pcStack_1dbd0 = (code *)0x11982a;
    fVar5 = fdb_set(pfStack_1dba0,(fdb_doc *)pfStack_1dbb8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119906;
    pcStack_1dbd0 = (code *)0x119841;
    fVar5 = fdb_commit(pfStack_1dbb0,'\x01');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011990b;
    pcStack_1dbd0 = (code *)0x119858;
    fVar5 = fdb_get_metaonly(pfStack_1dba8,(fdb_doc *)pfStack_1dbb8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119910;
    pcStack_1dbd0 = (code *)0x11986f;
    fVar5 = fdb_get_metaonly(pfStack_1dba0,(fdb_doc *)pfStack_1dbb8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119915;
    pcStack_1dbd0 = (code *)0x119886;
    fVar5 = fdb_get_byoffset(pfStack_1dba8,(fdb_doc *)pfStack_1dbb8);
    if (fVar5 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1dbd0 = (code *)0x119899;
      fdb_close(pfStack_1dbb0);
      pcStack_1dbd0 = (code *)0x1198a3;
      fdb_doc_free((fdb_doc *)pfStack_1dbb8);
      pcStack_1dbd0 = (code *)0x1198a8;
      fdb_shutdown();
      pcStack_1dbd0 = (code *)0x1198ad;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pcStack_1dbd0 = (code *)0x1198de;
      fprintf(_stderr,pcVar21,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1dbd0 = (code *)0x1198f2;
    get_byoffset_diff_kvs_test();
LAB_001198f2:
    pcStack_1dbd0 = (code *)0x1198f7;
    get_byoffset_diff_kvs_test();
LAB_001198f7:
    pcStack_1dbd0 = (code *)0x1198fc;
    get_byoffset_diff_kvs_test();
LAB_001198fc:
    pcStack_1dbd0 = (code *)0x119901;
    get_byoffset_diff_kvs_test();
LAB_00119901:
    pcStack_1dbd0 = (code *)0x119906;
    get_byoffset_diff_kvs_test();
LAB_00119906:
    pcStack_1dbd0 = (code *)0x11990b;
    get_byoffset_diff_kvs_test();
LAB_0011990b:
    pcStack_1dbd0 = (code *)0x119910;
    get_byoffset_diff_kvs_test();
LAB_00119910:
    pcStack_1dbd0 = (code *)0x119915;
    get_byoffset_diff_kvs_test();
LAB_00119915:
    pcStack_1dbd0 = (code *)0x11991a;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1dbd0 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1dbf8 = pfVar17;
  ppfStack_1dbf0 = doc;
  pfStack_1dbe8 = (fdb_kvs_handle *)pcVar21;
  ppfStack_1dbe0 = ptr_iterator;
  pfStack_1dbd8 = pfVar15;
  pcStack_1dbd0 = (code *)uVar23;
  gettimeofday(&tStack_1e008,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1dff8.wal_threshold = 0x400;
  fStack_1dff8.flags = 1;
  fStack_1dff8.purging_interval = 0;
  fStack_1dff8.compaction_threshold = '\0';
  fStack_1dff8.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1dff8.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1e060,"./dummy1",&fStack_1dff8);
  fdb_kvs_open_default(pfStack_1e060,&pfStack_1e068,&fStack_1e020);
  fVar5 = fdb_set_log_callback(pfStack_1e068,logCallbackFunc,"api_wrapper_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    fVar5 = fdb_set_kv(pfStack_1e068,(void *)0x0,0,(void *)0x0,0);
    if (fVar5 != FDB_RESULT_INVALID_ARGS) goto LAB_00119c74;
    uVar23 = 0;
    do {
      sprintf(acStack_1de00,"key%d",uVar23);
      sprintf(acStack_1dd00,"body%d",uVar23);
      pfVar15 = pfStack_1e068;
      sVar7 = strlen(acStack_1de00);
      sVar8 = strlen(acStack_1dd00);
      fVar5 = fdb_set_kv(pfVar15,acStack_1de00,sVar7,acStack_1dd00,sVar8);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119c56;
      }
      uVar20 = (int)uVar23 + 1;
      uVar23 = (ulong)uVar20;
    } while (uVar20 != 10);
    asStack_1e050[1] = 0x726162ffffffff;
    asStack_1e050[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1e038 = 0xbdbdbdbd;
    uStack_1e034 = 0xbdbdbdbd;
    uStack_1e030 = 0xbdbdbdbd;
    uStack_1e02c = 0xbdbdbdbd;
    uStack_1e028 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar5 = fdb_rekey(pfStack_1e060,new_key);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119c79;
    fdb_kvs_close(pfStack_1e068);
    fdb_close(pfStack_1e060);
    fStack_1dff8.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1dff8.encryption_key.bytes,"bar",4);
    fStack_1dff8.encryption_key.bytes[4] = 0xbd;
    fStack_1dff8.encryption_key.bytes[5] = 0xbd;
    fStack_1dff8.encryption_key.bytes[6] = 0xbd;
    fStack_1dff8.encryption_key.bytes[7] = 0xbd;
    fStack_1dff8.encryption_key.bytes[8] = 0xbd;
    fStack_1dff8.encryption_key.bytes[9] = 0xbd;
    fStack_1dff8.encryption_key.bytes[10] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0xb] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0xc] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0xd] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0xe] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0xf] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0x10] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0x11] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0x12] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0x13] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0x14] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0x15] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0x16] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0x17] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0x18] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0x19] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1dff8.encryption_key.bytes[0x1f] = 0xbd;
    fVar5 = fdb_open(&pfStack_1e060,"./dummy1",&fStack_1dff8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119c80;
    fVar5 = fdb_kvs_open_default(pfStack_1e060,&pfStack_1e068,&fStack_1e020);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      fVar5 = fdb_set_log_callback(pfStack_1e068,logCallbackFunc,"api_wrapper_test");
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00119c8e;
      uVar23 = 0;
      while( true ) {
        sprintf(acStack_1de00,"key%d",uVar23);
        pfVar15 = pfStack_1e068;
        sVar7 = strlen(acStack_1de00);
        fVar5 = fdb_get_kv(pfVar15,acStack_1de00,sVar7,&pvStack_1e058,asStack_1e050);
        if (fVar5 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1df00,"body%d",uVar23);
        ptr = pvStack_1e058;
        iVar6 = bcmp(pvStack_1e058,acStack_1df00,asStack_1e050[0]);
        if (iVar6 != 0) goto LAB_00119c56;
        fdb_free_block(ptr);
        uVar20 = (int)uVar23 + 1;
        uVar23 = (ulong)uVar20;
        if (uVar20 == 10) {
          fdb_kvs_close(pfStack_1e068);
          fdb_close(pfStack_1e060);
          fdb_shutdown();
          memleak_end();
          pcVar21 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar21 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar21,"encryption rekey test");
          return;
        }
      }
LAB_00119c66:
      rekey_test();
      goto LAB_00119c6d;
    }
  }
  else {
LAB_00119c6d:
    rekey_test();
LAB_00119c74:
    rekey_test();
LAB_00119c79:
    rekey_test();
LAB_00119c80:
    rekey_test();
  }
  rekey_test();
LAB_00119c8e:
  rekey_test();
  return;
}

Assistant:

void custom_seqnum_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    int num_kv = 4;
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle*, num_kv);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc real_doc;
    fdb_doc *rdoc = &real_doc;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], bodybuf[256];
    memset(&real_doc, 0, sizeof(fdb_doc));
    real_doc.key = &keybuf;
    real_doc.body = &bodybuf;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    r = 0;

    fdb_open(&dbfile, "./dummy1", &fconfig);
    if (multi_kv) {
        num_kv = 4;
        for (r = num_kv - 1; r >= 0; --r) {
            char tmp[16];
            sprintf(tmp, "kv%d", r);
            status = fdb_kvs_open(dbfile, &db[r], tmp, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_set_log_callback(db[r], logCallbackFunc,
                                          (void *) "custom_seqnum_test");
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    } else {
        num_kv = 1;
        status = fdb_kvs_open_default(dbfile, &db[r], &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                (void *) "custom_seqnum_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    for (i = 0; i < n/2; ++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf) + 1, NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        for (r = num_kv - 1; r >= 0; --r) {
            status = fdb_set(db[r], doc[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    for (i = n/2; i < n; ++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf) + 1, NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        for (r = num_kv - 1; r >= 0; --r) {
            fdb_doc_set_seqnum(doc[i], (i+1)*2); // double seqnum instead of ++
            status = fdb_set(db[r], doc[i]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    for (r = num_kv - 1; r >= 0; --r) {
        // range scan (before flushing WAL)
        fdb_iterator_init(db[r], &iterator, NULL, 0, NULL, 0, 0x0);
        i = 0;
        do {
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
            ++i;
            if (i <= n/2) {
                TEST_CHK(rdoc->seqnum == (fdb_seqnum_t)i);
            } else {
                TEST_CHK(rdoc->seqnum == (fdb_seqnum_t)i*2);
            }
        } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        fdb_iterator_close(iterator);

        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    }

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    for (i = n/2; i < n; ++i){
        sprintf(keybuf, "key%d", i);
        for (r = num_kv - 1; r >= 0; --r) {
            rdoc->seqnum = (i + 1)*2;
            status = fdb_get_byseq(db[r], rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf,"Custom sequence number test %s", multi_kv ?
            "multiple kv instances" : "single kv instance");
    TEST_RESULT(bodybuf);
}